

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  long lVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  float fVar61;
  byte bVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  uint uVar68;
  size_t sVar69;
  ulong uVar70;
  byte bVar71;
  ulong uVar72;
  float fVar73;
  float fVar130;
  float fVar132;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar74;
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar84 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar85 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar86 [16];
  float fVar136;
  float fVar137;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar138;
  undefined4 uVar139;
  float fVar153;
  float fVar154;
  vint4 bi_2;
  float fVar155;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined8 uVar156;
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar161;
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar173;
  float fVar181;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  vint4 ai;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [64];
  vint4 ai_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [64];
  float fVar209;
  float fVar210;
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [16];
  size_t local_610;
  undefined1 (*local_608) [32];
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar225 [64];
  
  PVar6 = prim[1];
  uVar72 = (ulong)(byte)PVar6;
  lVar55 = uVar72 * 0x19;
  fVar138 = *(float *)(prim + lVar55 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + lVar55 + 6));
  auVar174._0_4_ = fVar138 * auVar75._0_4_;
  auVar174._4_4_ = fVar138 * auVar75._4_4_;
  auVar174._8_4_ = fVar138 * auVar75._8_4_;
  auVar174._12_4_ = fVar138 * auVar75._12_4_;
  auVar84._0_4_ = fVar138 * auVar76._0_4_;
  auVar84._4_4_ = fVar138 * auVar76._4_4_;
  auVar84._8_4_ = fVar138 * auVar76._8_4_;
  auVar84._12_4_ = fVar138 * auVar76._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar72 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar70 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar72 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar63 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar218._4_4_ = auVar84._0_4_;
  auVar218._0_4_ = auVar84._0_4_;
  auVar218._8_4_ = auVar84._0_4_;
  auVar218._12_4_ = auVar84._0_4_;
  auVar20 = vshufps_avx(auVar84,auVar84,0x55);
  auVar79 = vshufps_avx(auVar84,auVar84,0xaa);
  fVar138 = auVar79._0_4_;
  auVar162._0_4_ = fVar138 * auVar18._0_4_;
  fVar153 = auVar79._4_4_;
  auVar162._4_4_ = fVar153 * auVar18._4_4_;
  fVar154 = auVar79._8_4_;
  auVar162._8_4_ = fVar154 * auVar18._8_4_;
  fVar155 = auVar79._12_4_;
  auVar162._12_4_ = fVar155 * auVar18._12_4_;
  auVar86._0_4_ = auVar83._0_4_ * fVar138;
  auVar86._4_4_ = auVar83._4_4_ * fVar153;
  auVar86._8_4_ = auVar83._8_4_ * fVar154;
  auVar86._12_4_ = auVar83._12_4_ * fVar155;
  auVar140._0_4_ = auVar19._0_4_ * fVar138;
  auVar140._4_4_ = auVar19._4_4_ * fVar153;
  auVar140._8_4_ = auVar19._8_4_ * fVar154;
  auVar140._12_4_ = auVar19._12_4_ * fVar155;
  auVar79 = vfmadd231ps_fma(auVar162,auVar20,auVar76);
  auVar78 = vfmadd231ps_fma(auVar86,auVar20,auVar82);
  auVar20 = vfmadd231ps_fma(auVar140,auVar80,auVar20);
  auVar77 = vfmadd231ps_fma(auVar79,auVar218,auVar75);
  auVar78 = vfmadd231ps_fma(auVar78,auVar218,auVar87);
  auVar84 = vfmadd231ps_fma(auVar20,auVar81,auVar218);
  auVar219._4_4_ = auVar174._0_4_;
  auVar219._0_4_ = auVar174._0_4_;
  auVar219._8_4_ = auVar174._0_4_;
  auVar219._12_4_ = auVar174._0_4_;
  auVar20 = vshufps_avx(auVar174,auVar174,0x55);
  auVar79 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar138 = auVar79._0_4_;
  auVar220._0_4_ = fVar138 * auVar18._0_4_;
  fVar153 = auVar79._4_4_;
  auVar220._4_4_ = fVar153 * auVar18._4_4_;
  fVar154 = auVar79._8_4_;
  auVar220._8_4_ = fVar154 * auVar18._8_4_;
  fVar155 = auVar79._12_4_;
  auVar220._12_4_ = fVar155 * auVar18._12_4_;
  auVar182._0_4_ = auVar83._0_4_ * fVar138;
  auVar182._4_4_ = auVar83._4_4_ * fVar153;
  auVar182._8_4_ = auVar83._8_4_ * fVar154;
  auVar182._12_4_ = auVar83._12_4_ * fVar155;
  auVar175._0_4_ = auVar19._0_4_ * fVar138;
  auVar175._4_4_ = auVar19._4_4_ * fVar153;
  auVar175._8_4_ = auVar19._8_4_ * fVar154;
  auVar175._12_4_ = auVar19._12_4_ * fVar155;
  auVar76 = vfmadd231ps_fma(auVar220,auVar20,auVar76);
  auVar18 = vfmadd231ps_fma(auVar182,auVar20,auVar82);
  auVar82 = vfmadd231ps_fma(auVar175,auVar20,auVar80);
  auVar83 = vfmadd231ps_fma(auVar76,auVar219,auVar75);
  auVar80 = vfmadd231ps_fma(auVar18,auVar219,auVar87);
  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar75);
  auVar19 = vfmadd231ps_fma(auVar82,auVar219,auVar81);
  auVar76 = vandps_avx512vl(auVar77,auVar75);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar76,auVar204,1);
  bVar11 = (bool)((byte)uVar70 & 1);
  auVar79._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._0_4_;
  bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._4_4_;
  bVar11 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._8_4_;
  bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._12_4_;
  auVar76 = vandps_avx512vl(auVar78,auVar75);
  uVar70 = vcmpps_avx512vl(auVar76,auVar204,1);
  bVar11 = (bool)((byte)uVar70 & 1);
  auVar77._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._0_4_;
  bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._4_4_;
  bVar11 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._8_4_;
  bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._12_4_;
  auVar75 = vandps_avx512vl(auVar84,auVar75);
  uVar70 = vcmpps_avx512vl(auVar75,auVar204,1);
  bVar11 = (bool)((byte)uVar70 & 1);
  auVar78._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._0_4_;
  bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._4_4_;
  bVar11 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._8_4_;
  bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._12_4_;
  auVar76 = vrcp14ps_avx512vl(auVar79);
  auVar205._8_4_ = 0x3f800000;
  auVar205._0_8_ = 0x3f8000003f800000;
  auVar205._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar79,auVar76,auVar205);
  auVar87 = vfmadd132ps_fma(auVar75,auVar76,auVar76);
  auVar76 = vrcp14ps_avx512vl(auVar77);
  auVar75 = vfnmadd213ps_fma(auVar77,auVar76,auVar205);
  auVar82 = vfmadd132ps_fma(auVar75,auVar76,auVar76);
  auVar76 = vrcp14ps_avx512vl(auVar78);
  auVar75 = vfnmadd213ps_fma(auVar78,auVar76,auVar205);
  auVar81 = vfmadd132ps_fma(auVar75,auVar76,auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar83);
  auVar196._0_4_ = auVar87._0_4_ * auVar75._0_4_;
  auVar196._4_4_ = auVar87._4_4_ * auVar75._4_4_;
  auVar196._8_4_ = auVar87._8_4_ * auVar75._8_4_;
  auVar196._12_4_ = auVar87._12_4_ * auVar75._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar76);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar83);
  auVar79 = vpbroadcastd_avx512vl();
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar76 = vpmovsxwd_avx(auVar18);
  auVar163._0_4_ = auVar87._0_4_ * auVar75._0_4_;
  auVar163._4_4_ = auVar87._4_4_ * auVar75._4_4_;
  auVar163._8_4_ = auVar87._8_4_ * auVar75._8_4_;
  auVar163._12_4_ = auVar87._12_4_ * auVar75._12_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar72 * -2 + 6);
  auVar75 = vpmovsxwd_avx(auVar87);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar80);
  auVar206._0_4_ = auVar82._0_4_ * auVar75._0_4_;
  auVar206._4_4_ = auVar82._4_4_ * auVar75._4_4_;
  auVar206._8_4_ = auVar82._8_4_ * auVar75._8_4_;
  auVar206._12_4_ = auVar82._12_4_ * auVar75._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar76);
  auVar75 = vsubps_avx(auVar75,auVar80);
  auVar157._0_4_ = auVar82._0_4_ * auVar75._0_4_;
  auVar157._4_4_ = auVar82._4_4_ * auVar75._4_4_;
  auVar157._8_4_ = auVar82._8_4_ * auVar75._8_4_;
  auVar157._12_4_ = auVar82._12_4_ * auVar75._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar63 + uVar72 + 6);
  auVar75 = vpmovsxwd_avx(auVar82);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar19);
  auVar183._0_4_ = auVar81._0_4_ * auVar75._0_4_;
  auVar183._4_4_ = auVar81._4_4_ * auVar75._4_4_;
  auVar183._8_4_ = auVar81._8_4_ * auVar75._8_4_;
  auVar183._12_4_ = auVar81._12_4_ * auVar75._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar75 = vpmovsxwd_avx(auVar83);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar19);
  auVar85._0_4_ = auVar81._0_4_ * auVar75._0_4_;
  auVar85._4_4_ = auVar81._4_4_ * auVar75._4_4_;
  auVar85._8_4_ = auVar81._8_4_ * auVar75._8_4_;
  auVar85._12_4_ = auVar81._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar196,auVar163);
  auVar76 = vpminsd_avx(auVar206,auVar157);
  auVar75 = vmaxps_avx(auVar75,auVar76);
  auVar76 = vpminsd_avx(auVar183,auVar85);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar81._4_4_ = uVar3;
  auVar81._0_4_ = uVar3;
  auVar81._8_4_ = uVar3;
  auVar81._12_4_ = uVar3;
  auVar76 = vmaxps_avx512vl(auVar76,auVar81);
  auVar75 = vmaxps_avx(auVar75,auVar76);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  local_5d0 = vmulps_avx512vl(auVar75,auVar80);
  auVar228 = ZEXT1664(local_5d0);
  auVar75 = vpmaxsd_avx(auVar196,auVar163);
  auVar76 = vpmaxsd_avx(auVar206,auVar157);
  auVar75 = vminps_avx(auVar75,auVar76);
  auVar76 = vpmaxsd_avx(auVar183,auVar85);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar19._4_4_ = uVar3;
  auVar19._0_4_ = uVar3;
  auVar19._8_4_ = uVar3;
  auVar19._12_4_ = uVar3;
  auVar76 = vminps_avx512vl(auVar76,auVar19);
  auVar75 = vminps_avx(auVar75,auVar76);
  auVar20._8_4_ = 0x3f800003;
  auVar20._0_8_ = 0x3f8000033f800003;
  auVar20._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar20);
  uVar156 = vcmpps_avx512vl(local_5d0,auVar75,2);
  uVar70 = vpcmpgtd_avx512vl(auVar79,_DAT_01f7fcf0);
  uVar70 = ((byte)uVar156 & 0xf) & uVar70;
  if ((char)uVar70 != '\0') {
    local_608 = (undefined1 (*) [32])&local_140;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar229 = ZEXT3264(_DAT_01faff40);
    sVar69 = k;
    local_610 = k;
    do {
      lVar22 = 0;
      for (uVar63 = uVar70; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar70 = uVar70 - 1 & uVar70;
      uVar3 = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar63 = (ulong)(uint)((int)lVar22 << 6);
      uVar68 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar68].ptr;
      auVar75 = *(undefined1 (*) [16])(prim + uVar63 + lVar55 + 0x16);
      if (uVar70 != 0) {
        uVar66 = uVar70 - 1 & uVar70;
        for (uVar72 = uVar70; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        }
        if (uVar66 != 0) {
          for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar76 = *(undefined1 (*) [16])(prim + uVar63 + lVar55 + 0x26);
      auVar18 = *(undefined1 (*) [16])(prim + uVar63 + lVar55 + 0x36);
      auVar87 = *(undefined1 (*) [16])(prim + uVar63 + lVar55 + 0x46);
      iVar7 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar69 * 4)),
                              ZEXT416(*(uint *)(ray + sVar69 * 4 + 0x20)),0x1c);
      auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + sVar69 * 4 + 0x40)),0x28);
      auVar81 = vsubps_avx(auVar75,auVar82);
      uVar139 = auVar81._0_4_;
      auVar164._4_4_ = uVar139;
      auVar164._0_4_ = uVar139;
      auVar164._8_4_ = uVar139;
      auVar164._12_4_ = uVar139;
      auVar83 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar138 = pre->ray_space[k].vz.field_0.m128[0];
      fVar153 = pre->ray_space[k].vz.field_0.m128[1];
      fVar154 = pre->ray_space[k].vz.field_0.m128[2];
      fVar155 = pre->ray_space[k].vz.field_0.m128[3];
      auVar208._0_4_ = fVar138 * auVar81._0_4_;
      auVar208._4_4_ = fVar153 * auVar81._4_4_;
      auVar208._8_4_ = fVar154 * auVar81._8_4_;
      auVar208._12_4_ = fVar155 * auVar81._12_4_;
      auVar83 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar83);
      auVar19 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar164);
      auVar83 = vshufps_avx(auVar75,auVar75,0xff);
      auVar80 = vsubps_avx(auVar76,auVar82);
      uVar139 = auVar80._0_4_;
      auVar176._4_4_ = uVar139;
      auVar176._0_4_ = uVar139;
      auVar176._8_4_ = uVar139;
      auVar176._12_4_ = uVar139;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar211._0_4_ = fVar138 * auVar80._0_4_;
      auVar211._4_4_ = fVar153 * auVar80._4_4_;
      auVar211._8_4_ = fVar154 * auVar80._8_4_;
      auVar211._12_4_ = fVar155 * auVar80._12_4_;
      auVar81 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar81);
      auVar20 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar176);
      auVar80 = vsubps_avx512vl(auVar18,auVar82);
      uVar139 = auVar80._0_4_;
      auVar177._4_4_ = uVar139;
      auVar177._0_4_ = uVar139;
      auVar177._8_4_ = uVar139;
      auVar177._12_4_ = uVar139;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar215._0_4_ = fVar138 * auVar80._0_4_;
      auVar215._4_4_ = fVar153 * auVar80._4_4_;
      auVar215._8_4_ = fVar154 * auVar80._8_4_;
      auVar215._12_4_ = fVar155 * auVar80._12_4_;
      auVar81 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar5,auVar81);
      auVar80 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar177);
      auVar81 = vsubps_avx512vl(auVar87,auVar82);
      uVar139 = auVar81._0_4_;
      auVar165._4_4_ = uVar139;
      auVar165._0_4_ = uVar139;
      auVar165._8_4_ = uVar139;
      auVar165._12_4_ = uVar139;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar216._0_4_ = fVar138 * auVar81._0_4_;
      auVar216._4_4_ = fVar153 * auVar81._4_4_;
      auVar216._8_4_ = fVar154 * auVar81._8_4_;
      auVar216._12_4_ = fVar155 * auVar81._12_4_;
      auVar82 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar82);
      auVar81 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar165);
      lVar22 = (long)iVar7 * 0x44;
      auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar139 = auVar19._0_4_;
      local_400._4_4_ = uVar139;
      local_400._0_4_ = uVar139;
      local_400._8_4_ = uVar139;
      local_400._12_4_ = uVar139;
      local_400._16_4_ = uVar139;
      local_400._20_4_ = uVar139;
      local_400._24_4_ = uVar139;
      local_400._28_4_ = uVar139;
      auVar88._8_4_ = 1;
      auVar88._0_8_ = 0x100000001;
      auVar88._12_4_ = 1;
      auVar88._16_4_ = 1;
      auVar88._20_4_ = 1;
      auVar88._24_4_ = 1;
      auVar88._28_4_ = 1;
      local_420 = vpermps_avx2(auVar88,ZEXT1632(auVar19));
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      local_440 = vbroadcastss_avx512vl(auVar20);
      local_460 = vpermps_avx512vl(auVar88,ZEXT1632(auVar20));
      auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_480 = vbroadcastss_avx512vl(auVar80);
      local_4a0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar80));
      auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0xd8c);
      fVar161 = auVar81._0_4_;
      local_4c0._4_4_ = fVar161;
      local_4c0._0_4_ = fVar161;
      fStack_4b8 = fVar161;
      fStack_4b4 = fVar161;
      fStack_4b0 = fVar161;
      fStack_4ac = fVar161;
      fStack_4a8 = fVar161;
      register0x0000139c = fVar161;
      _local_4e0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar81));
      auVar88 = vmulps_avx512vl(_local_4c0,auVar100);
      auVar89 = vmulps_avx512vl(_local_4e0,auVar100);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_480);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,local_4a0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,local_440);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,local_460);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar103,local_400);
      auVar203 = ZEXT3264(auVar90);
      auVar91 = vfmadd231ps_avx512vl(auVar89,auVar103,local_420);
      auVar195 = ZEXT3264(auVar91);
      auVar88 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar89 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar92 = vmulps_avx512vl(_local_4c0,auVar98);
      auVar93 = vmulps_avx512vl(_local_4e0,auVar98);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_480);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_4a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_440);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_460);
      auVar79 = vfmadd231ps_fma(auVar92,auVar88,local_400);
      auVar207 = ZEXT1664(auVar79);
      auVar78 = vfmadd231ps_fma(auVar93,auVar88,local_420);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar79),auVar90);
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar78),auVar91);
      auVar94 = vmulps_avx512vl(auVar91,auVar92);
      auVar95 = vmulps_avx512vl(auVar90,auVar93);
      auVar94 = vsubps_avx512vl(auVar94,auVar95);
      auVar82 = vshufps_avx(auVar76,auVar76,0xff);
      uVar156 = auVar83._0_8_;
      local_80._8_8_ = uVar156;
      local_80._0_8_ = uVar156;
      local_80._16_8_ = uVar156;
      local_80._24_8_ = uVar156;
      local_a0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(auVar18,auVar18,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(auVar87,auVar87,0xff);
      uVar156 = auVar82._0_8_;
      local_e0._8_8_ = uVar156;
      local_e0._0_8_ = uVar156;
      local_e0._16_8_ = uVar156;
      local_e0._24_8_ = uVar156;
      auVar95 = vmulps_avx512vl(local_e0,auVar100);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,local_a0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_80);
      auVar96 = vmulps_avx512vl(local_e0,auVar98);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_c0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar89,local_a0);
      auVar77 = vfmadd231ps_fma(auVar96,auVar88,local_80);
      auVar96 = vmulps_avx512vl(auVar93,auVar93);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar92);
      auVar97 = vmaxps_avx512vl(auVar95,ZEXT1632(auVar77));
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      auVar96 = vmulps_avx512vl(auVar97,auVar96);
      auVar94 = vmulps_avx512vl(auVar94,auVar94);
      uVar156 = vcmpps_avx512vl(auVar94,auVar96,2);
      auVar82 = vblendps_avx(auVar19,auVar75,8);
      auVar140 = auVar227._0_16_;
      auVar83 = vandps_avx512vl(auVar82,auVar140);
      auVar82 = vblendps_avx(auVar20,auVar76,8);
      auVar82 = vandps_avx512vl(auVar82,auVar140);
      auVar83 = vmaxps_avx(auVar83,auVar82);
      auVar82 = vblendps_avx(auVar80,auVar18,8);
      auVar84 = vandps_avx512vl(auVar82,auVar140);
      auVar82 = vblendps_avx(auVar81,auVar87,8);
      auVar82 = vandps_avx512vl(auVar82,auVar140);
      auVar82 = vmaxps_avx(auVar84,auVar82);
      auVar82 = vmaxps_avx(auVar83,auVar82);
      auVar83 = vmovshdup_avx(auVar82);
      auVar83 = vmaxss_avx(auVar83,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar83);
      local_620 = vcvtsi2ss_avx512f(auVar140,iVar7);
      auVar96._0_4_ = local_620._0_4_;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar96._16_4_ = auVar96._0_4_;
      auVar96._20_4_ = auVar96._0_4_;
      auVar96._24_4_ = auVar96._0_4_;
      auVar96._28_4_ = auVar96._0_4_;
      uVar21 = vcmpps_avx512vl(auVar96,auVar229._0_32_,0xe);
      bVar71 = (byte)uVar156 & (byte)uVar21;
      fVar138 = auVar82._0_4_ * 4.7683716e-07;
      auVar97._8_4_ = 2;
      auVar97._0_8_ = 0x200000002;
      auVar97._12_4_ = 2;
      auVar97._16_4_ = 2;
      auVar97._20_4_ = 2;
      auVar97._24_4_ = 2;
      auVar97._28_4_ = 2;
      auVar94 = vpermps_avx512vl(auVar97,ZEXT1632(auVar19));
      auVar226 = ZEXT3264(auVar94);
      local_240 = vpermps_avx2(auVar97,ZEXT1632(auVar20));
      local_260 = vpermps_avx2(auVar97,ZEXT1632(auVar80));
      local_280 = vpermps_avx2(auVar97,ZEXT1632(auVar81));
      uVar64 = *(uint *)(ray + sVar69 * 4 + 0x60);
      local_580._0_16_ = ZEXT416(uVar64);
      local_660 = auVar76._0_8_;
      uStack_658 = auVar76._8_8_;
      local_670 = auVar18._0_8_;
      uStack_668 = auVar18._8_8_;
      local_680._0_4_ = auVar87._0_4_;
      fVar153 = (float)local_680;
      local_680._4_4_ = auVar87._4_4_;
      fVar154 = local_680._4_4_;
      uStack_678._0_4_ = auVar87._8_4_;
      fVar155 = (float)uStack_678;
      uStack_678._4_4_ = auVar87._12_4_;
      fVar61 = uStack_678._4_4_;
      local_680 = auVar87._0_8_;
      uStack_678 = auVar87._8_8_;
      if (bVar71 != 0) {
        auVar98 = vmulps_avx512vl(local_280,auVar98);
        auVar99 = vfmadd213ps_avx512vl(auVar99,local_260,auVar98);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_240,auVar99);
        auVar97 = vfmadd213ps_avx512vl(auVar88,auVar94,auVar89);
        auVar100 = vmulps_avx512vl(local_280,auVar100);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_260,auVar100);
        auVar89 = vfmadd213ps_avx512vl(auVar104,local_240,auVar101);
        auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        auVar88 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1f9c);
        auVar102 = vfmadd213ps_avx512vl(auVar103,auVar94,auVar89);
        auVar212._0_4_ = fVar161 * auVar88._0_4_;
        auVar212._4_4_ = fVar161 * auVar88._4_4_;
        auVar212._8_4_ = fVar161 * auVar88._8_4_;
        auVar212._12_4_ = fVar161 * auVar88._12_4_;
        auVar212._16_4_ = fVar161 * auVar88._16_4_;
        auVar212._20_4_ = fVar161 * auVar88._20_4_;
        auVar212._24_4_ = fVar161 * auVar88._24_4_;
        auVar212._28_4_ = 0;
        auVar103 = vmulps_avx512vl(_local_4e0,auVar88);
        auVar88 = vmulps_avx512vl(local_280,auVar88);
        auVar89 = vfmadd231ps_avx512vl(auVar212,auVar100,local_480);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_4a0);
        auVar100 = vfmadd231ps_avx512vl(auVar88,local_260,auVar100);
        auVar88 = vfmadd231ps_avx512vl(auVar89,auVar101,local_440);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,local_460);
        auVar89 = vfmadd231ps_avx512vl(auVar100,local_240,auVar101);
        auVar87 = vfmadd231ps_fma(auVar88,auVar104,local_400);
        auVar88 = vfmadd231ps_avx512vl(auVar103,auVar104,local_420);
        auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1f9c);
        auVar99 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar104);
        auVar89._4_4_ = fVar161 * auVar100._4_4_;
        auVar89._0_4_ = fVar161 * auVar100._0_4_;
        auVar89._8_4_ = fVar161 * auVar100._8_4_;
        auVar89._12_4_ = fVar161 * auVar100._12_4_;
        auVar89._16_4_ = fVar161 * auVar100._16_4_;
        auVar89._20_4_ = fVar161 * auVar100._20_4_;
        auVar89._24_4_ = fVar161 * auVar100._24_4_;
        auVar89._28_4_ = auVar104._28_4_;
        auVar104 = vmulps_avx512vl(_local_4e0,auVar100);
        auVar100 = vmulps_avx512vl(local_280,auVar100);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,local_480);
        auVar98 = vfmadd231ps_avx512vl(auVar104,auVar101,local_4a0);
        auVar101 = vfmadd231ps_avx512vl(auVar100,local_260,auVar101);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar100 = vfmadd231ps_avx512vl(auVar89,auVar104,local_440);
        auVar89 = vfmadd231ps_avx512vl(auVar98,auVar104,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar101,local_240,auVar104);
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar227 = ZEXT1664(auVar82);
        auVar82 = vfmadd231ps_fma(auVar100,auVar103,local_400);
        auVar101 = vfmadd231ps_avx512vl(auVar89,auVar103,local_420);
        auVar100 = vfmadd231ps_avx512vl(auVar104,auVar94,auVar103);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(ZEXT1632(auVar87),auVar221);
        auVar104 = vandps_avx(auVar88,auVar221);
        auVar104 = vmaxps_avx(auVar103,auVar104);
        auVar103 = vandps_avx(auVar99,auVar221);
        auVar103 = vmaxps_avx(auVar104,auVar103);
        auVar217._4_4_ = fVar138;
        auVar217._0_4_ = fVar138;
        auVar217._8_4_ = fVar138;
        auVar217._12_4_ = fVar138;
        auVar217._16_4_ = fVar138;
        auVar217._20_4_ = fVar138;
        auVar217._24_4_ = fVar138;
        auVar217._28_4_ = fVar138;
        uVar63 = vcmpps_avx512vl(auVar103,auVar217,1);
        bVar11 = (bool)((byte)uVar63 & 1);
        auVar105._0_4_ = (float)((uint)bVar11 * auVar92._0_4_ | (uint)!bVar11 * auVar87._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar11 * auVar92._4_4_ | (uint)!bVar11 * auVar87._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar11 * auVar92._8_4_ | (uint)!bVar11 * auVar87._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar11 * auVar92._12_4_ | (uint)!bVar11 * auVar87._12_4_);
        fVar210 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar92._16_4_);
        auVar105._16_4_ = fVar210;
        fVar209 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar92._20_4_);
        auVar105._20_4_ = fVar209;
        fVar161 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar92._24_4_);
        auVar105._24_4_ = fVar161;
        uVar65 = (uint)(byte)(uVar63 >> 7) * auVar92._28_4_;
        auVar105._28_4_ = uVar65;
        bVar11 = (bool)((byte)uVar63 & 1);
        auVar106._0_4_ = (float)((uint)bVar11 * auVar93._0_4_ | (uint)!bVar11 * auVar88._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar88._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar88._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar88._12_4_);
        bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar11 * auVar93._16_4_ | (uint)!bVar11 * auVar88._16_4_);
        bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar11 * auVar93._20_4_ | (uint)!bVar11 * auVar88._20_4_);
        bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar11 * auVar93._24_4_ | (uint)!bVar11 * auVar88._24_4_);
        bVar11 = SUB81(uVar63 >> 7,0);
        auVar106._28_4_ = (uint)bVar11 * auVar93._28_4_ | (uint)!bVar11 * auVar88._28_4_;
        auVar103 = vandps_avx(auVar221,ZEXT1632(auVar82));
        auVar104 = vandps_avx(auVar101,auVar221);
        auVar104 = vmaxps_avx(auVar103,auVar104);
        auVar103 = vandps_avx(auVar100,auVar221);
        auVar103 = vmaxps_avx(auVar104,auVar103);
        uVar63 = vcmpps_avx512vl(auVar103,auVar217,1);
        bVar11 = (bool)((byte)uVar63 & 1);
        auVar107._0_4_ = (float)((uint)bVar11 * auVar92._0_4_ | (uint)!bVar11 * auVar82._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar11 * auVar92._4_4_ | (uint)!bVar11 * auVar82._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar11 * auVar92._8_4_ | (uint)!bVar11 * auVar82._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar11 * auVar92._12_4_ | (uint)!bVar11 * auVar82._12_4_);
        fVar181 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar92._16_4_);
        auVar107._16_4_ = fVar181;
        fVar172 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar92._20_4_);
        auVar107._20_4_ = fVar172;
        fVar173 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar92._24_4_);
        auVar107._24_4_ = fVar173;
        auVar107._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar92._28_4_;
        bVar11 = (bool)((byte)uVar63 & 1);
        auVar108._0_4_ = (float)((uint)bVar11 * auVar93._0_4_ | (uint)!bVar11 * auVar101._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar101._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar101._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar101._12_4_);
        bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar11 * auVar93._16_4_ | (uint)!bVar11 * auVar101._16_4_);
        bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar11 * auVar93._20_4_ | (uint)!bVar11 * auVar101._20_4_);
        bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar11 * auVar93._24_4_ | (uint)!bVar11 * auVar101._24_4_);
        bVar11 = SUB81(uVar63 >> 7,0);
        auVar108._28_4_ = (uint)bVar11 * auVar93._28_4_ | (uint)!bVar11 * auVar101._28_4_;
        auVar85 = vxorps_avx512vl(local_440._0_16_,local_440._0_16_);
        auVar103 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar85));
        auVar87 = vfmadd231ps_fma(auVar103,auVar106,auVar106);
        auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar73 = auVar101._0_4_;
        fVar74 = auVar101._4_4_;
        fVar130 = auVar101._8_4_;
        fVar131 = auVar101._12_4_;
        fVar132 = auVar101._16_4_;
        fVar133 = auVar101._20_4_;
        fVar134 = auVar101._24_4_;
        auVar103._4_4_ = fVar74 * fVar74 * fVar74 * auVar87._4_4_ * -0.5;
        auVar103._0_4_ = fVar73 * fVar73 * fVar73 * auVar87._0_4_ * -0.5;
        auVar103._8_4_ = fVar130 * fVar130 * fVar130 * auVar87._8_4_ * -0.5;
        auVar103._12_4_ = fVar131 * fVar131 * fVar131 * auVar87._12_4_ * -0.5;
        auVar103._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar103._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar103._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar103._28_4_ = 0;
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar101);
        auVar104._4_4_ = auVar106._4_4_ * auVar103._4_4_;
        auVar104._0_4_ = auVar106._0_4_ * auVar103._0_4_;
        auVar104._8_4_ = auVar106._8_4_ * auVar103._8_4_;
        auVar104._12_4_ = auVar106._12_4_ * auVar103._12_4_;
        auVar104._16_4_ = auVar106._16_4_ * auVar103._16_4_;
        auVar104._20_4_ = auVar106._20_4_ * auVar103._20_4_;
        auVar104._24_4_ = auVar106._24_4_ * auVar103._24_4_;
        auVar104._28_4_ = auVar101._28_4_;
        auVar101._4_4_ = auVar103._4_4_ * -auVar105._4_4_;
        auVar101._0_4_ = auVar103._0_4_ * -auVar105._0_4_;
        auVar101._8_4_ = auVar103._8_4_ * -auVar105._8_4_;
        auVar101._12_4_ = auVar103._12_4_ * -auVar105._12_4_;
        auVar101._16_4_ = auVar103._16_4_ * -fVar210;
        auVar101._20_4_ = auVar103._20_4_ * -fVar209;
        auVar101._24_4_ = auVar103._24_4_ * -fVar161;
        auVar101._28_4_ = uVar65 ^ 0x80000000;
        auVar89 = vmulps_avx512vl(auVar103,ZEXT1632(auVar85));
        auVar92 = ZEXT1632(auVar85);
        auVar100 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar92);
        auVar87 = vfmadd231ps_fma(auVar100,auVar108,auVar108);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar161 = auVar98._0_4_;
        fVar209 = auVar98._4_4_;
        fVar210 = auVar98._8_4_;
        fVar73 = auVar98._12_4_;
        fVar74 = auVar98._16_4_;
        fVar130 = auVar98._20_4_;
        fVar131 = auVar98._24_4_;
        auVar100._4_4_ = fVar209 * fVar209 * fVar209 * auVar87._4_4_ * -0.5;
        auVar100._0_4_ = fVar161 * fVar161 * fVar161 * auVar87._0_4_ * -0.5;
        auVar100._8_4_ = fVar210 * fVar210 * fVar210 * auVar87._8_4_ * -0.5;
        auVar100._12_4_ = fVar73 * fVar73 * fVar73 * auVar87._12_4_ * -0.5;
        auVar100._16_4_ = fVar74 * fVar74 * fVar74 * -0.0;
        auVar100._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar100._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar100._28_4_ = 0;
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar98);
        auVar99._4_4_ = auVar108._4_4_ * auVar100._4_4_;
        auVar99._0_4_ = auVar108._0_4_ * auVar100._0_4_;
        auVar99._8_4_ = auVar108._8_4_ * auVar100._8_4_;
        auVar99._12_4_ = auVar108._12_4_ * auVar100._12_4_;
        auVar99._16_4_ = auVar108._16_4_ * auVar100._16_4_;
        auVar99._20_4_ = auVar108._20_4_ * auVar100._20_4_;
        auVar99._24_4_ = auVar108._24_4_ * auVar100._24_4_;
        auVar99._28_4_ = auVar98._28_4_;
        auVar98._4_4_ = -auVar107._4_4_ * auVar100._4_4_;
        auVar98._0_4_ = -auVar107._0_4_ * auVar100._0_4_;
        auVar98._8_4_ = -auVar107._8_4_ * auVar100._8_4_;
        auVar98._12_4_ = -auVar107._12_4_ * auVar100._12_4_;
        auVar98._16_4_ = -fVar181 * auVar100._16_4_;
        auVar98._20_4_ = -fVar172 * auVar100._20_4_;
        auVar98._24_4_ = -fVar173 * auVar100._24_4_;
        auVar98._28_4_ = auVar103._28_4_;
        auVar103 = vmulps_avx512vl(auVar100,auVar92);
        auVar87 = vfmadd213ps_fma(auVar104,auVar95,auVar90);
        auVar82 = vfmadd213ps_fma(auVar101,auVar95,auVar91);
        auVar100 = vfmadd213ps_avx512vl(auVar89,auVar95,auVar102);
        auVar88 = vfmadd213ps_avx512vl(auVar99,ZEXT1632(auVar77),ZEXT1632(auVar79));
        auVar20 = vfnmadd213ps_fma(auVar104,auVar95,auVar90);
        auVar90 = ZEXT1632(auVar77);
        auVar83 = vfmadd213ps_fma(auVar98,auVar90,ZEXT1632(auVar78));
        auVar84 = vfnmadd213ps_fma(auVar101,auVar95,auVar91);
        auVar81 = vfmadd213ps_fma(auVar103,auVar90,auVar97);
        auVar104 = vfnmadd231ps_avx512vl(auVar102,auVar95,auVar89);
        auVar79 = vfnmadd213ps_fma(auVar99,auVar90,ZEXT1632(auVar79));
        auVar78 = vfnmadd213ps_fma(auVar98,auVar90,ZEXT1632(auVar78));
        auVar140 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar77),auVar103);
        auVar101 = vsubps_avx512vl(auVar88,ZEXT1632(auVar20));
        auVar103 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar84));
        auVar89 = vsubps_avx512vl(ZEXT1632(auVar81),auVar104);
        auVar99 = vmulps_avx512vl(auVar103,auVar104);
        auVar80 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar84),auVar89);
        auVar90._4_4_ = auVar20._4_4_ * auVar89._4_4_;
        auVar90._0_4_ = auVar20._0_4_ * auVar89._0_4_;
        auVar90._8_4_ = auVar20._8_4_ * auVar89._8_4_;
        auVar90._12_4_ = auVar20._12_4_ * auVar89._12_4_;
        auVar90._16_4_ = auVar89._16_4_ * 0.0;
        auVar90._20_4_ = auVar89._20_4_ * 0.0;
        auVar90._24_4_ = auVar89._24_4_ * 0.0;
        auVar90._28_4_ = auVar89._28_4_;
        auVar89 = vfmsub231ps_avx512vl(auVar90,auVar104,auVar101);
        auVar91._4_4_ = auVar84._4_4_ * auVar101._4_4_;
        auVar91._0_4_ = auVar84._0_4_ * auVar101._0_4_;
        auVar91._8_4_ = auVar84._8_4_ * auVar101._8_4_;
        auVar91._12_4_ = auVar84._12_4_ * auVar101._12_4_;
        auVar91._16_4_ = auVar101._16_4_ * 0.0;
        auVar91._20_4_ = auVar101._20_4_ * 0.0;
        auVar91._24_4_ = auVar101._24_4_ * 0.0;
        auVar91._28_4_ = auVar101._28_4_;
        auVar19 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar20),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar92,auVar89);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar92,ZEXT1632(auVar80));
        auVar97 = ZEXT1632(auVar85);
        uVar63 = vcmpps_avx512vl(auVar103,auVar97,2);
        bVar62 = (byte)uVar63;
        fVar73 = (float)((uint)(bVar62 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar79._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        fVar130 = (float)((uint)bVar11 * auVar87._4_4_ | (uint)!bVar11 * auVar79._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        fVar132 = (float)((uint)bVar11 * auVar87._8_4_ | (uint)!bVar11 * auVar79._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        fVar134 = (float)((uint)bVar11 * auVar87._12_4_ | (uint)!bVar11 * auVar79._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar73))));
        fVar74 = (float)((uint)(bVar62 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar78._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        fVar131 = (float)((uint)bVar11 * auVar82._4_4_ | (uint)!bVar11 * auVar78._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        fVar133 = (float)((uint)bVar11 * auVar82._8_4_ | (uint)!bVar11 * auVar78._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        fVar135 = (float)((uint)bVar11 * auVar82._12_4_ | (uint)!bVar11 * auVar78._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar74))));
        auVar109._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar100._0_4_ |
                    (uint)!(bool)(bVar62 & 1) * auVar140._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar140._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar140._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar140._12_4_);
        fVar210 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_);
        auVar109._16_4_ = fVar210;
        fVar161 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_);
        auVar109._20_4_ = fVar161;
        fVar209 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_);
        auVar109._24_4_ = fVar209;
        iVar1 = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
        auVar109._28_4_ = iVar1;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar20),auVar88);
        auVar110._0_4_ =
             (uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar80._0_4_;
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar80._4_4_;
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar80._8_4_;
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar80._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_;
        auVar110._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar83));
        auVar111._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar82._0_4_
                    );
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar82._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar82._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar82._12_4_);
        fVar173 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
        auVar111._16_4_ = fVar173;
        fVar172 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
        auVar111._20_4_ = fVar172;
        fVar181 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
        auVar111._24_4_ = fVar181;
        auVar111._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar81));
        auVar112._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar101._0_4_ |
                    (uint)!(bool)(bVar62 & 1) * auVar100._0_4_);
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar100._4_4_);
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar100._8_4_);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar100._12_4_);
        bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar11 * auVar101._16_4_ | (uint)!bVar11 * auVar100._16_4_);
        bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar11 * auVar101._20_4_ | (uint)!bVar11 * auVar100._20_4_);
        bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar11 * auVar101._24_4_ | (uint)!bVar11 * auVar100._24_4_);
        bVar11 = SUB81(uVar63 >> 7,0);
        auVar112._28_4_ = (uint)bVar11 * auVar101._28_4_ | (uint)!bVar11 * auVar100._28_4_;
        auVar113._0_4_ =
             (uint)(bVar62 & 1) * (int)auVar20._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar88._0_4_;
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar11 * (int)auVar20._4_4_ | (uint)!bVar11 * auVar88._4_4_;
        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar11 * (int)auVar20._8_4_ | (uint)!bVar11 * auVar88._8_4_;
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar11 * (int)auVar20._12_4_ | (uint)!bVar11 * auVar88._12_4_;
        auVar113._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar88._16_4_;
        auVar113._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar88._20_4_;
        auVar113._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar88._24_4_;
        auVar113._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar88._28_4_;
        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar114._0_4_ =
             (uint)(bVar62 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar81._0_4_;
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar81._4_4_;
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar81._8_4_;
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar81._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar104._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar104._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar63 >> 7) * auVar104._28_4_;
        auVar114._28_4_ = iVar2;
        auVar90 = vsubps_avx512vl(auVar113,auVar99);
        auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar84._12_4_ |
                                                 (uint)!bVar14 * auVar83._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar84._8_4_ |
                                                          (uint)!bVar13 * auVar83._8_4_,
                                                          CONCAT44((uint)bVar11 * (int)auVar84._4_4_
                                                                   | (uint)!bVar11 * auVar83._4_4_,
                                                                   (uint)(bVar62 & 1) *
                                                                   (int)auVar84._0_4_ |
                                                                   (uint)!(bool)(bVar62 & 1) *
                                                                   auVar83._0_4_)))),auVar98);
        auVar203 = ZEXT3264(auVar104);
        auVar101 = vsubps_avx(auVar114,auVar109);
        auVar100 = vsubps_avx(auVar99,auVar110);
        auVar207 = ZEXT3264(auVar100);
        auVar88 = vsubps_avx(auVar98,auVar111);
        auVar89 = vsubps_avx(auVar109,auVar112);
        auVar92._4_4_ = auVar101._4_4_ * fVar130;
        auVar92._0_4_ = auVar101._0_4_ * fVar73;
        auVar92._8_4_ = auVar101._8_4_ * fVar132;
        auVar92._12_4_ = auVar101._12_4_ * fVar134;
        auVar92._16_4_ = auVar101._16_4_ * 0.0;
        auVar92._20_4_ = auVar101._20_4_ * 0.0;
        auVar92._24_4_ = auVar101._24_4_ * 0.0;
        auVar92._28_4_ = iVar2;
        auVar87 = vfmsub231ps_fma(auVar92,auVar109,auVar90);
        auVar93._4_4_ = fVar131 * auVar90._4_4_;
        auVar93._0_4_ = fVar74 * auVar90._0_4_;
        auVar93._8_4_ = fVar133 * auVar90._8_4_;
        auVar93._12_4_ = fVar135 * auVar90._12_4_;
        auVar93._16_4_ = auVar90._16_4_ * 0.0;
        auVar93._20_4_ = auVar90._20_4_ * 0.0;
        auVar93._24_4_ = auVar90._24_4_ * 0.0;
        auVar93._28_4_ = auVar103._28_4_;
        auVar82 = vfmsub231ps_fma(auVar93,auVar99,auVar104);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar97,ZEXT1632(auVar87));
        auVar190._0_4_ = auVar104._0_4_ * auVar109._0_4_;
        auVar190._4_4_ = auVar104._4_4_ * auVar109._4_4_;
        auVar190._8_4_ = auVar104._8_4_ * auVar109._8_4_;
        auVar190._12_4_ = auVar104._12_4_ * auVar109._12_4_;
        auVar190._16_4_ = auVar104._16_4_ * fVar210;
        auVar190._20_4_ = auVar104._20_4_ * fVar161;
        auVar190._24_4_ = auVar104._24_4_ * fVar209;
        auVar190._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar190,auVar98,auVar101);
        auVar91 = vfmadd231ps_avx512vl(auVar103,auVar97,ZEXT1632(auVar87));
        auVar103 = vmulps_avx512vl(auVar89,auVar110);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar100,auVar112);
        auVar102._4_4_ = auVar88._4_4_ * auVar112._4_4_;
        auVar102._0_4_ = auVar88._0_4_ * auVar112._0_4_;
        auVar102._8_4_ = auVar88._8_4_ * auVar112._8_4_;
        auVar102._12_4_ = auVar88._12_4_ * auVar112._12_4_;
        auVar102._16_4_ = auVar88._16_4_ * auVar112._16_4_;
        auVar102._20_4_ = auVar88._20_4_ * auVar112._20_4_;
        auVar102._24_4_ = auVar88._24_4_ * auVar112._24_4_;
        auVar102._28_4_ = auVar112._28_4_;
        auVar87 = vfmsub231ps_fma(auVar102,auVar111,auVar89);
        auVar191._0_4_ = auVar111._0_4_ * auVar100._0_4_;
        auVar191._4_4_ = auVar111._4_4_ * auVar100._4_4_;
        auVar191._8_4_ = auVar111._8_4_ * auVar100._8_4_;
        auVar191._12_4_ = auVar111._12_4_ * auVar100._12_4_;
        auVar191._16_4_ = fVar173 * auVar100._16_4_;
        auVar191._20_4_ = fVar172 * auVar100._20_4_;
        auVar191._24_4_ = fVar181 * auVar100._24_4_;
        auVar191._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar191,auVar88,auVar110);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar97,auVar103);
        auVar92 = vfmadd231ps_avx512vl(auVar103,auVar97,ZEXT1632(auVar87));
        auVar195 = ZEXT3264(auVar92);
        auVar103 = vmaxps_avx(auVar91,auVar92);
        uVar156 = vcmpps_avx512vl(auVar103,auVar97,2);
        bVar71 = bVar71 & (byte)uVar156;
        if (bVar71 != 0) {
          uVar139 = *(undefined4 *)(ray + sVar69 * 4 + 0x100);
          auVar222._4_4_ = uVar139;
          auVar222._0_4_ = uVar139;
          auVar222._8_4_ = uVar139;
          auVar222._12_4_ = uVar139;
          auVar222._16_4_ = uVar139;
          auVar222._20_4_ = uVar139;
          auVar222._24_4_ = uVar139;
          auVar222._28_4_ = uVar139;
          auVar225 = ZEXT3264(auVar222);
          auVar33._4_4_ = auVar89._4_4_ * auVar104._4_4_;
          auVar33._0_4_ = auVar89._0_4_ * auVar104._0_4_;
          auVar33._8_4_ = auVar89._8_4_ * auVar104._8_4_;
          auVar33._12_4_ = auVar89._12_4_ * auVar104._12_4_;
          auVar33._16_4_ = auVar89._16_4_ * auVar104._16_4_;
          auVar33._20_4_ = auVar89._20_4_ * auVar104._20_4_;
          auVar33._24_4_ = auVar89._24_4_ * auVar104._24_4_;
          auVar33._28_4_ = auVar103._28_4_;
          auVar81 = vfmsub231ps_fma(auVar33,auVar88,auVar101);
          auVar34._4_4_ = auVar101._4_4_ * auVar100._4_4_;
          auVar34._0_4_ = auVar101._0_4_ * auVar100._0_4_;
          auVar34._8_4_ = auVar101._8_4_ * auVar100._8_4_;
          auVar34._12_4_ = auVar101._12_4_ * auVar100._12_4_;
          auVar34._16_4_ = auVar101._16_4_ * auVar100._16_4_;
          auVar34._20_4_ = auVar101._20_4_ * auVar100._20_4_;
          auVar34._24_4_ = auVar101._24_4_ * auVar100._24_4_;
          auVar34._28_4_ = auVar101._28_4_;
          auVar83 = vfmsub231ps_fma(auVar34,auVar90,auVar89);
          auVar35._4_4_ = auVar88._4_4_ * auVar90._4_4_;
          auVar35._0_4_ = auVar88._0_4_ * auVar90._0_4_;
          auVar35._8_4_ = auVar88._8_4_ * auVar90._8_4_;
          auVar35._12_4_ = auVar88._12_4_ * auVar90._12_4_;
          auVar35._16_4_ = auVar88._16_4_ * auVar90._16_4_;
          auVar35._20_4_ = auVar88._20_4_ * auVar90._20_4_;
          auVar35._24_4_ = auVar88._24_4_ * auVar90._24_4_;
          auVar35._28_4_ = auVar88._28_4_;
          auVar80 = vfmsub231ps_fma(auVar35,auVar100,auVar104);
          auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar80));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
          auVar207 = ZEXT3264(auVar103);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = 0x3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar104 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar82),auVar28);
          auVar87 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
          auVar203 = ZEXT1664(auVar87);
          auVar36._4_4_ = auVar80._4_4_ * auVar109._4_4_;
          auVar36._0_4_ = auVar80._0_4_ * auVar109._0_4_;
          auVar36._8_4_ = auVar80._8_4_ * auVar109._8_4_;
          auVar36._12_4_ = auVar80._12_4_ * auVar109._12_4_;
          auVar36._16_4_ = fVar210 * 0.0;
          auVar36._20_4_ = fVar161 * 0.0;
          auVar36._24_4_ = fVar209 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar83 = vfmadd231ps_fma(auVar36,auVar98,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar99,ZEXT1632(auVar81));
          fVar161 = auVar87._0_4_;
          fVar209 = auVar87._4_4_;
          fVar210 = auVar87._8_4_;
          fVar173 = auVar87._12_4_;
          local_560 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar173,
                                         CONCAT48(auVar83._8_4_ * fVar210,
                                                  CONCAT44(auVar83._4_4_ * fVar209,
                                                           auVar83._0_4_ * fVar161))));
          auVar214 = ZEXT3264(local_560);
          auVar145._4_4_ = uVar64;
          auVar145._0_4_ = uVar64;
          auVar145._8_4_ = uVar64;
          auVar145._12_4_ = uVar64;
          auVar145._16_4_ = uVar64;
          auVar145._20_4_ = uVar64;
          auVar145._24_4_ = uVar64;
          auVar145._28_4_ = uVar64;
          uVar156 = vcmpps_avx512vl(local_560,auVar222,2);
          uVar21 = vcmpps_avx512vl(auVar145,local_560,2);
          bVar71 = (byte)uVar156 & (byte)uVar21 & bVar71;
          if (bVar71 != 0) {
            uVar72 = vcmpps_avx512vl(ZEXT1632(auVar82),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar72 = bVar71 & uVar72;
            if ((char)uVar72 != '\0') {
              fVar172 = auVar91._0_4_ * fVar161;
              fVar181 = auVar91._4_4_ * fVar209;
              auVar37._4_4_ = fVar181;
              auVar37._0_4_ = fVar172;
              fVar73 = auVar91._8_4_ * fVar210;
              auVar37._8_4_ = fVar73;
              fVar74 = auVar91._12_4_ * fVar173;
              auVar37._12_4_ = fVar74;
              fVar130 = auVar91._16_4_ * 0.0;
              auVar37._16_4_ = fVar130;
              fVar131 = auVar91._20_4_ * 0.0;
              auVar37._20_4_ = fVar131;
              fVar132 = auVar91._24_4_ * 0.0;
              auVar37._24_4_ = fVar132;
              auVar37._28_4_ = auVar91._28_4_;
              auVar146._8_4_ = 0x3f800000;
              auVar146._0_8_ = 0x3f8000003f800000;
              auVar146._12_4_ = 0x3f800000;
              auVar146._16_4_ = 0x3f800000;
              auVar146._20_4_ = 0x3f800000;
              auVar146._24_4_ = 0x3f800000;
              auVar146._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar146,auVar37);
              local_3e0._0_4_ =
                   (uint)(bVar62 & 1) * (int)fVar172 | (uint)!(bool)(bVar62 & 1) * auVar103._0_4_;
              bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
              local_3e0._4_4_ = (uint)bVar11 * (int)fVar181 | (uint)!bVar11 * auVar103._4_4_;
              bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
              local_3e0._8_4_ = (uint)bVar11 * (int)fVar73 | (uint)!bVar11 * auVar103._8_4_;
              bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
              local_3e0._12_4_ = (uint)bVar11 * (int)fVar74 | (uint)!bVar11 * auVar103._12_4_;
              bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
              local_3e0._16_4_ = (uint)bVar11 * (int)fVar130 | (uint)!bVar11 * auVar103._16_4_;
              bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
              local_3e0._20_4_ = (uint)bVar11 * (int)fVar131 | (uint)!bVar11 * auVar103._20_4_;
              bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
              local_3e0._24_4_ = (uint)bVar11 * (int)fVar132 | (uint)!bVar11 * auVar103._24_4_;
              bVar11 = SUB81(uVar63 >> 7,0);
              local_3e0._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar103._28_4_;
              auVar103 = vsubps_avx(ZEXT1632(auVar77),auVar95);
              auVar87 = vfmadd213ps_fma(auVar103,local_3e0,auVar95);
              uVar139 = *(undefined4 *)((long)pre->ray_space + sVar69 * 4 + -0x20);
              auVar95._4_4_ = uVar139;
              auVar95._0_4_ = uVar139;
              auVar95._8_4_ = uVar139;
              auVar95._12_4_ = uVar139;
              auVar95._16_4_ = uVar139;
              auVar95._20_4_ = uVar139;
              auVar95._24_4_ = uVar139;
              auVar95._28_4_ = uVar139;
              auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                            CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                     CONCAT44(auVar87._4_4_ +
                                                                              auVar87._4_4_,
                                                                              auVar87._0_4_ +
                                                                              auVar87._0_4_)))),
                                         auVar95);
              uVar66 = vcmpps_avx512vl(local_560,auVar103,6);
              uVar72 = uVar72 & uVar66;
              bVar71 = (byte)uVar72;
              if (bVar71 != 0) {
                auVar170._0_4_ = auVar92._0_4_ * fVar161;
                auVar170._4_4_ = auVar92._4_4_ * fVar209;
                auVar170._8_4_ = auVar92._8_4_ * fVar210;
                auVar170._12_4_ = auVar92._12_4_ * fVar173;
                auVar170._16_4_ = auVar92._16_4_ * 0.0;
                auVar170._20_4_ = auVar92._20_4_ * 0.0;
                auVar170._24_4_ = auVar92._24_4_ * 0.0;
                auVar170._28_4_ = 0;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = 0x3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar178,auVar170);
                auVar115._0_4_ =
                     (uint)(bVar62 & 1) * (int)auVar170._0_4_ |
                     (uint)!(bool)(bVar62 & 1) * auVar103._0_4_;
                bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar11 * (int)auVar170._4_4_ | (uint)!bVar11 * auVar103._4_4_
                ;
                bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar11 * (int)auVar170._8_4_ | (uint)!bVar11 * auVar103._8_4_
                ;
                bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
                auVar115._12_4_ =
                     (uint)bVar11 * (int)auVar170._12_4_ | (uint)!bVar11 * auVar103._12_4_;
                bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
                auVar115._16_4_ =
                     (uint)bVar11 * (int)auVar170._16_4_ | (uint)!bVar11 * auVar103._16_4_;
                bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
                auVar115._20_4_ =
                     (uint)bVar11 * (int)auVar170._20_4_ | (uint)!bVar11 * auVar103._20_4_;
                bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                auVar115._24_4_ =
                     (uint)bVar11 * (int)auVar170._24_4_ | (uint)!bVar11 * auVar103._24_4_;
                auVar115._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar103._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar115,auVar178,auVar29);
                local_380 = 0;
                local_360 = local_660;
                uStack_358 = uStack_658;
                local_350 = local_670;
                uStack_348 = uStack_668;
                local_340 = local_680;
                uStack_338 = uStack_678;
                if ((pGVar9->mask & *(uint *)(ray + sVar69 * 4 + 0x120)) != 0) {
                  local_5a0._0_8_ = pGVar9;
                  auVar103 = vaddps_avx512vl(local_3e0,auVar229._0_32_);
                  fVar161 = 1.0 / auVar96._0_4_;
                  local_320[0] = fVar161 * auVar103._0_4_;
                  local_320[1] = fVar161 * auVar103._4_4_;
                  local_320[2] = fVar161 * auVar103._8_4_;
                  local_320[3] = fVar161 * auVar103._12_4_;
                  fStack_310 = fVar161 * auVar103._16_4_;
                  fStack_30c = fVar161 * auVar103._20_4_;
                  fStack_308 = fVar161 * auVar103._24_4_;
                  fStack_304 = (float)auVar103._28_4_;
                  local_300 = local_3c0;
                  local_2e0 = local_560;
                  auVar147._8_4_ = 0x7f800000;
                  auVar147._0_8_ = 0x7f8000007f800000;
                  auVar147._12_4_ = 0x7f800000;
                  auVar147._16_4_ = 0x7f800000;
                  auVar147._20_4_ = 0x7f800000;
                  auVar147._24_4_ = 0x7f800000;
                  auVar147._28_4_ = 0x7f800000;
                  auVar103 = vblendmps_avx512vl(auVar147,local_560);
                  auVar116._0_4_ =
                       (uint)(bVar71 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                  auVar116._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar72 >> 2) & 1);
                  auVar116._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar72 >> 3) & 1);
                  auVar116._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar72 >> 4) & 1);
                  auVar116._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                  auVar116._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                  auVar116._24_4_ = (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = SUB81(uVar72 >> 7,0);
                  auVar116._28_4_ = (uint)bVar11 * auVar103._28_4_ | (uint)!bVar11 * 0x7f800000;
                  auVar103 = vshufps_avx(auVar116,auVar116,0xb1);
                  auVar103 = vminps_avx(auVar116,auVar103);
                  auVar104 = vshufpd_avx(auVar103,auVar103,5);
                  auVar103 = vminps_avx(auVar103,auVar104);
                  auVar104 = vpermpd_avx2(auVar103,0x4e);
                  auVar103 = vminps_avx(auVar103,auVar104);
                  uVar156 = vcmpps_avx512vl(auVar116,auVar103,0);
                  uVar64 = (uint)uVar72;
                  if (((byte)uVar156 & bVar71) != 0) {
                    uVar64 = (uint)((byte)uVar156 & bVar71);
                  }
                  uVar65 = 0;
                  for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
                    uVar65 = uVar65 + 1;
                  }
                  uVar63 = (ulong)uVar65;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_500 = vpbroadcastd_avx512vl();
                    local_520 = vpbroadcastd_avx512vl();
                    local_5c0 = auVar94;
                    local_3a0 = local_560;
                    local_37c = iVar7;
                    local_370 = auVar75;
                    do {
                      fVar161 = local_320[uVar63];
                      auVar159._4_4_ = fVar161;
                      auVar159._0_4_ = fVar161;
                      auVar159._8_4_ = fVar161;
                      auVar159._12_4_ = fVar161;
                      local_1c0._16_4_ = fVar161;
                      local_1c0._0_16_ = auVar159;
                      local_1c0._20_4_ = fVar161;
                      local_1c0._24_4_ = fVar161;
                      local_1c0._28_4_ = fVar161;
                      local_1a0 = *(undefined4 *)(local_300 + uVar63 * 4);
                      *(undefined4 *)(ray + sVar69 * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + uVar63 * 4);
                      local_650.context = context->user;
                      fVar209 = 1.0 - fVar161;
                      auVar27._8_4_ = 0x80000000;
                      auVar27._0_8_ = 0x8000000080000000;
                      auVar27._12_4_ = 0x80000000;
                      auVar83 = vxorps_avx512vl(ZEXT416((uint)fVar209),auVar27);
                      auVar87 = ZEXT416((uint)(fVar161 * fVar209 * 4.0));
                      auVar82 = vfnmsub213ss_fma(auVar159,auVar159,auVar87);
                      auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),
                                                auVar87);
                      auVar207 = ZEXT464(0x3f000000);
                      fVar209 = fVar209 * auVar83._0_4_ * 0.5;
                      fVar210 = auVar82._0_4_ * 0.5;
                      fVar173 = auVar87._0_4_ * 0.5;
                      fVar161 = fVar161 * fVar161 * 0.5;
                      auVar199._0_4_ = fVar161 * fVar153;
                      auVar199._4_4_ = fVar161 * fVar154;
                      auVar199._8_4_ = fVar161 * fVar155;
                      auVar199._12_4_ = fVar161 * fVar61;
                      auVar143._4_4_ = fVar173;
                      auVar143._0_4_ = fVar173;
                      auVar143._8_4_ = fVar173;
                      auVar143._12_4_ = fVar173;
                      auVar87 = vfmadd132ps_fma(auVar143,auVar199,auVar18);
                      auVar189._4_4_ = fVar210;
                      auVar189._0_4_ = fVar210;
                      auVar189._8_4_ = fVar210;
                      auVar189._12_4_ = fVar210;
                      auVar87 = vfmadd132ps_fma(auVar189,auVar87,auVar76);
                      auVar144._4_4_ = fVar209;
                      auVar144._0_4_ = fVar209;
                      auVar144._8_4_ = fVar209;
                      auVar144._12_4_ = fVar209;
                      auVar87 = vfmadd213ps_fma(auVar144,auVar75,auVar87);
                      local_220 = auVar87._0_4_;
                      auVar94._8_4_ = 1;
                      auVar94._0_8_ = 0x100000001;
                      auVar94._12_4_ = 1;
                      auVar94._16_4_ = 1;
                      auVar94._20_4_ = 1;
                      auVar94._24_4_ = 1;
                      auVar94._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar94,ZEXT1632(auVar87));
                      auVar195 = ZEXT3264(local_200);
                      auVar200._8_4_ = 2;
                      auVar200._0_8_ = 0x200000002;
                      auVar200._12_4_ = 2;
                      auVar202._16_4_ = 2;
                      auVar202._0_16_ = auVar200;
                      auVar202._20_4_ = 2;
                      auVar202._24_4_ = 2;
                      auVar202._28_4_ = 2;
                      auVar203 = ZEXT3264(auVar202);
                      local_1e0 = vpermps_avx2(auVar202,ZEXT1632(auVar87));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_520._0_8_;
                      uStack_178 = local_520._8_8_;
                      uStack_170 = local_520._16_8_;
                      uStack_168 = local_520._24_8_;
                      local_160 = local_500;
                      auVar103 = vpcmpeqd_avx2(local_500,local_500);
                      local_608[1] = auVar103;
                      *local_608 = auVar103;
                      local_140 = (local_650.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_650.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_600 = local_2a0;
                      local_650.valid = (int *)local_600;
                      local_650.geometryUserPtr = *(void **)(local_5a0._0_8_ + 0x18);
                      local_650.hit = (RTCHitN *)&local_220;
                      local_650.N = 8;
                      _local_540 = auVar225._0_32_;
                      local_650.ray = (RTCRayN *)ray;
                      if (*(code **)(local_5a0._0_8_ + 0x40) != (code *)0x0) {
                        auVar195 = ZEXT1664(local_200._0_16_);
                        auVar203 = ZEXT1664(auVar200);
                        auVar207 = ZEXT1664(auVar207._0_16_);
                        (**(code **)(local_5a0._0_8_ + 0x40))(&local_650);
                        auVar214 = ZEXT3264(local_560);
                        auVar225 = ZEXT3264(_local_540);
                        auVar226 = ZEXT3264(local_5c0);
                        auVar229 = ZEXT3264(_DAT_01faff40);
                        auVar228 = ZEXT1664(local_5d0);
                        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar227 = ZEXT1664(auVar87);
                        sVar69 = local_610;
                      }
                      if (local_600 == (undefined1  [32])0x0) {
LAB_01a6c0f9:
                        *(int *)(ray + sVar69 * 4 + 0x100) = auVar225._0_4_;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_5a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar195 = ZEXT1664(auVar195._0_16_);
                          auVar203 = ZEXT1664(auVar203._0_16_);
                          auVar207 = ZEXT1664(auVar207._0_16_);
                          (*p_Var10)(&local_650);
                          auVar214 = ZEXT3264(local_560);
                          auVar225 = ZEXT3264(_local_540);
                          auVar226 = ZEXT3264(local_5c0);
                          auVar229 = ZEXT3264(_DAT_01faff40);
                          auVar228 = ZEXT1664(local_5d0);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar227 = ZEXT1664(auVar87);
                          sVar69 = local_610;
                        }
                        if (local_600 == (undefined1  [32])0x0) goto LAB_01a6c0f9;
                        uVar66 = vptestmd_avx512vl(local_600,local_600);
                        iVar1 = *(int *)(local_650.hit + 4);
                        iVar2 = *(int *)(local_650.hit + 8);
                        iVar56 = *(int *)(local_650.hit + 0xc);
                        iVar57 = *(int *)(local_650.hit + 0x10);
                        iVar58 = *(int *)(local_650.hit + 0x14);
                        iVar59 = *(int *)(local_650.hit + 0x18);
                        iVar60 = *(int *)(local_650.hit + 0x1c);
                        bVar71 = (byte)uVar66;
                        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar66 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
                        bVar17 = SUB81(uVar66 >> 7,0);
                        *(uint *)(local_650.ray + 0x180) =
                             (uint)(bVar71 & 1) * *(int *)local_650.hit |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x180);
                        *(uint *)(local_650.ray + 0x184) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_650.ray + 0x184);
                        *(uint *)(local_650.ray + 0x188) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_650.ray + 0x188);
                        *(uint *)(local_650.ray + 0x18c) =
                             (uint)bVar13 * iVar56 | (uint)!bVar13 * *(int *)(local_650.ray + 0x18c)
                        ;
                        *(uint *)(local_650.ray + 400) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_650.ray + 400);
                        *(uint *)(local_650.ray + 0x194) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_650.ray + 0x194)
                        ;
                        *(uint *)(local_650.ray + 0x198) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_650.ray + 0x198)
                        ;
                        *(uint *)(local_650.ray + 0x19c) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_650.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x24);
                        iVar2 = *(int *)(local_650.hit + 0x28);
                        iVar56 = *(int *)(local_650.hit + 0x2c);
                        iVar57 = *(int *)(local_650.hit + 0x30);
                        iVar58 = *(int *)(local_650.hit + 0x34);
                        iVar59 = *(int *)(local_650.hit + 0x38);
                        iVar60 = *(int *)(local_650.hit + 0x3c);
                        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar66 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
                        bVar17 = SUB81(uVar66 >> 7,0);
                        *(uint *)(local_650.ray + 0x1a0) =
                             (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x20) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1a0);
                        *(uint *)(local_650.ray + 0x1a4) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_650.ray + 0x1a4);
                        *(uint *)(local_650.ray + 0x1a8) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_650.ray + 0x1a8);
                        *(uint *)(local_650.ray + 0x1ac) =
                             (uint)bVar13 * iVar56 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1ac)
                        ;
                        *(uint *)(local_650.ray + 0x1b0) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1b0)
                        ;
                        *(uint *)(local_650.ray + 0x1b4) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1b4)
                        ;
                        *(uint *)(local_650.ray + 0x1b8) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1b8)
                        ;
                        *(uint *)(local_650.ray + 0x1bc) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x44);
                        iVar2 = *(int *)(local_650.hit + 0x48);
                        iVar56 = *(int *)(local_650.hit + 0x4c);
                        iVar57 = *(int *)(local_650.hit + 0x50);
                        iVar58 = *(int *)(local_650.hit + 0x54);
                        iVar59 = *(int *)(local_650.hit + 0x58);
                        iVar60 = *(int *)(local_650.hit + 0x5c);
                        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar66 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
                        bVar17 = SUB81(uVar66 >> 7,0);
                        *(uint *)(local_650.ray + 0x1c0) =
                             (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x40) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1c0);
                        *(uint *)(local_650.ray + 0x1c4) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_650.ray + 0x1c4);
                        *(uint *)(local_650.ray + 0x1c8) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_650.ray + 0x1c8);
                        *(uint *)(local_650.ray + 0x1cc) =
                             (uint)bVar13 * iVar56 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1cc)
                        ;
                        *(uint *)(local_650.ray + 0x1d0) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1d0)
                        ;
                        *(uint *)(local_650.ray + 0x1d4) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1d4)
                        ;
                        *(uint *)(local_650.ray + 0x1d8) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1d8)
                        ;
                        *(uint *)(local_650.ray + 0x1dc) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 100);
                        iVar2 = *(int *)(local_650.hit + 0x68);
                        iVar56 = *(int *)(local_650.hit + 0x6c);
                        iVar57 = *(int *)(local_650.hit + 0x70);
                        iVar58 = *(int *)(local_650.hit + 0x74);
                        iVar59 = *(int *)(local_650.hit + 0x78);
                        iVar60 = *(int *)(local_650.hit + 0x7c);
                        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar66 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
                        bVar17 = SUB81(uVar66 >> 7,0);
                        *(uint *)(local_650.ray + 0x1e0) =
                             (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x60) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1e0);
                        *(uint *)(local_650.ray + 0x1e4) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_650.ray + 0x1e4);
                        *(uint *)(local_650.ray + 0x1e8) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_650.ray + 0x1e8);
                        *(uint *)(local_650.ray + 0x1ec) =
                             (uint)bVar13 * iVar56 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1ec)
                        ;
                        *(uint *)(local_650.ray + 0x1f0) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1f0)
                        ;
                        *(uint *)(local_650.ray + 500) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_650.ray + 500);
                        *(uint *)(local_650.ray + 0x1f8) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1f8)
                        ;
                        *(uint *)(local_650.ray + 0x1fc) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x84);
                        iVar2 = *(int *)(local_650.hit + 0x88);
                        iVar56 = *(int *)(local_650.hit + 0x8c);
                        iVar57 = *(int *)(local_650.hit + 0x90);
                        iVar58 = *(int *)(local_650.hit + 0x94);
                        iVar59 = *(int *)(local_650.hit + 0x98);
                        iVar60 = *(int *)(local_650.hit + 0x9c);
                        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar66 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar66 >> 6) & 1);
                        bVar17 = SUB81(uVar66 >> 7,0);
                        *(uint *)(local_650.ray + 0x200) =
                             (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x80) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x200);
                        *(uint *)(local_650.ray + 0x204) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_650.ray + 0x204);
                        *(uint *)(local_650.ray + 0x208) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_650.ray + 0x208);
                        *(uint *)(local_650.ray + 0x20c) =
                             (uint)bVar13 * iVar56 | (uint)!bVar13 * *(int *)(local_650.ray + 0x20c)
                        ;
                        *(uint *)(local_650.ray + 0x210) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_650.ray + 0x210)
                        ;
                        *(uint *)(local_650.ray + 0x214) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_650.ray + 0x214)
                        ;
                        *(uint *)(local_650.ray + 0x218) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_650.ray + 0x218)
                        ;
                        *(uint *)(local_650.ray + 0x21c) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_650.ray + 0x21c)
                        ;
                        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0));
                        *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar103;
                        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0));
                        *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar103;
                        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0));
                        *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar103;
                        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar103;
                        auVar225 = ZEXT464(*(uint *)(ray + sVar69 * 4 + 0x100));
                      }
                      auVar94 = auVar226._0_32_;
                      bVar71 = ~(byte)(1 << ((uint)uVar63 & 0x1f)) & (byte)uVar72;
                      uVar139 = auVar225._0_4_;
                      auVar151._4_4_ = uVar139;
                      auVar151._0_4_ = uVar139;
                      auVar151._8_4_ = uVar139;
                      auVar151._12_4_ = uVar139;
                      auVar151._16_4_ = uVar139;
                      auVar151._20_4_ = uVar139;
                      auVar151._24_4_ = uVar139;
                      auVar151._28_4_ = uVar139;
                      uVar156 = vcmpps_avx512vl(auVar214._0_32_,auVar151,2);
                      if ((bVar71 & (byte)uVar156) == 0) goto LAB_01a6afb5;
                      bVar71 = bVar71 & (byte)uVar156;
                      uVar72 = (ulong)bVar71;
                      auVar152._8_4_ = 0x7f800000;
                      auVar152._0_8_ = 0x7f8000007f800000;
                      auVar152._12_4_ = 0x7f800000;
                      auVar152._16_4_ = 0x7f800000;
                      auVar152._20_4_ = 0x7f800000;
                      auVar152._24_4_ = 0x7f800000;
                      auVar152._28_4_ = 0x7f800000;
                      auVar103 = vblendmps_avx512vl(auVar152,auVar214._0_32_);
                      auVar129._0_4_ =
                           (uint)(bVar71 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                      bVar11 = (bool)(bVar71 >> 1 & 1);
                      auVar129._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar71 >> 2 & 1);
                      auVar129._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar71 >> 3 & 1);
                      auVar129._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar71 >> 4 & 1);
                      auVar129._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar71 >> 5 & 1);
                      auVar129._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar71 >> 6 & 1);
                      auVar129._24_4_ = (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * 0x7f800000;
                      auVar129._28_4_ =
                           (uint)(bVar71 >> 7) * auVar103._28_4_ |
                           (uint)!(bool)(bVar71 >> 7) * 0x7f800000;
                      auVar103 = vshufps_avx(auVar129,auVar129,0xb1);
                      auVar103 = vminps_avx(auVar129,auVar103);
                      auVar104 = vshufpd_avx(auVar103,auVar103,5);
                      auVar103 = vminps_avx(auVar103,auVar104);
                      auVar104 = vpermpd_avx2(auVar103,0x4e);
                      auVar103 = vminps_avx(auVar103,auVar104);
                      uVar156 = vcmpps_avx512vl(auVar129,auVar103,0);
                      bVar62 = (byte)uVar156 & bVar71;
                      if (bVar62 != 0) {
                        bVar71 = bVar62;
                      }
                      uVar64 = 0;
                      for (uVar65 = (uint)bVar71; (uVar65 & 1) == 0;
                          uVar65 = uVar65 >> 1 | 0x80000000) {
                        uVar64 = uVar64 + 1;
                      }
                      uVar63 = (ulong)uVar64;
                    } while( true );
                  }
                  fVar161 = local_320[uVar63];
                  uVar139 = *(undefined4 *)(local_300 + uVar63 * 4);
                  fVar209 = 1.0 - fVar161;
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar83 = vxorps_avx512vl(ZEXT416((uint)fVar209),auVar23);
                  auVar87 = ZEXT416((uint)(fVar161 * fVar209 * 4.0));
                  auVar82 = vfnmsub213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),auVar87);
                  auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),auVar87);
                  fVar209 = fVar209 * auVar83._0_4_ * 0.5;
                  fVar210 = auVar82._0_4_ * 0.5;
                  auVar203 = ZEXT464((uint)fVar210);
                  fVar173 = auVar87._0_4_ * 0.5;
                  fVar172 = fVar161 * fVar161 * 0.5;
                  auVar184._0_4_ = fVar172 * fVar153;
                  auVar184._4_4_ = fVar172 * fVar154;
                  auVar184._8_4_ = fVar172 * fVar155;
                  auVar184._12_4_ = fVar172 * fVar61;
                  auVar166._4_4_ = fVar173;
                  auVar166._0_4_ = fVar173;
                  auVar166._8_4_ = fVar173;
                  auVar166._12_4_ = fVar173;
                  auVar87 = vfmadd132ps_fma(auVar166,auVar184,auVar18);
                  auVar185._4_4_ = fVar210;
                  auVar185._0_4_ = fVar210;
                  auVar185._8_4_ = fVar210;
                  auVar185._12_4_ = fVar210;
                  auVar87 = vfmadd132ps_fma(auVar185,auVar87,auVar76);
                  auVar195 = ZEXT1664(auVar87);
                  auVar167._4_4_ = fVar209;
                  auVar167._0_4_ = fVar209;
                  auVar167._8_4_ = fVar209;
                  auVar167._12_4_ = fVar209;
                  auVar87 = vfmadd213ps_fma(auVar167,auVar75,auVar87);
                  *(undefined4 *)(ray + sVar69 * 4 + 0x100) =
                       *(undefined4 *)(local_2e0 + uVar63 * 4);
                  *(int *)(ray + sVar69 * 4 + 0x180) = auVar87._0_4_;
                  uVar8 = vextractps_avx(auVar87,1);
                  *(undefined4 *)(ray + sVar69 * 4 + 0x1a0) = uVar8;
                  uVar8 = vextractps_avx(auVar87,2);
                  *(undefined4 *)(ray + sVar69 * 4 + 0x1c0) = uVar8;
                  *(float *)(ray + sVar69 * 4 + 0x1e0) = fVar161;
                  *(undefined4 *)(ray + sVar69 * 4 + 0x200) = uVar139;
                  *(undefined4 *)(ray + sVar69 * 4 + 0x220) = uVar3;
                  *(uint *)(ray + sVar69 * 4 + 0x240) = uVar68;
                  *(uint *)(ray + sVar69 * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + sVar69 * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01a6afb5:
      if (8 < iVar7) {
        local_5a0 = vpbroadcastd_avx512vl();
        local_540._4_4_ = fVar138;
        local_540._0_4_ = fVar138;
        fStack_538 = fVar138;
        fStack_534 = fVar138;
        fStack_530 = fVar138;
        fStack_52c = fVar138;
        fStack_528 = fVar138;
        fStack_524 = fVar138;
        local_500._4_4_ = local_580._0_4_;
        local_500._0_4_ = local_580._0_4_;
        local_500._8_4_ = local_580._0_4_;
        local_500._12_4_ = local_580._0_4_;
        local_500._16_4_ = local_580._0_4_;
        local_500._20_4_ = local_580._0_4_;
        local_500._24_4_ = local_580._0_4_;
        local_500._28_4_ = local_580._0_4_;
        local_100 = 1.0 / (float)local_620._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_520 = vpbroadcastd_avx512vl();
        local_560 = vpbroadcastd_avx512vl();
        lVar67 = 8;
        local_5c0 = auVar94;
LAB_01a6b05b:
        auVar103 = vpbroadcastd_avx512vl();
        auVar103 = vpor_avx2(auVar103,_DAT_01fe9900);
        uVar21 = vpcmpd_avx512vl(auVar103,local_5a0,1);
        auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar67 * 4 + lVar22);
        auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21aefac + lVar67 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar22 + 0x21af430 + lVar67 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar22 + 0x21af8b4 + lVar67 * 4);
        auVar226._0_4_ = auVar100._0_4_ * (float)local_4c0._0_4_;
        auVar226._4_4_ = auVar100._4_4_ * (float)local_4c0._4_4_;
        auVar226._8_4_ = auVar100._8_4_ * fStack_4b8;
        auVar226._12_4_ = auVar100._12_4_ * fStack_4b4;
        auVar226._16_4_ = auVar100._16_4_ * fStack_4b0;
        auVar226._20_4_ = auVar100._20_4_ * fStack_4ac;
        auVar226._28_36_ = auVar203._28_36_;
        auVar226._24_4_ = auVar100._24_4_ * fStack_4a8;
        auVar203._0_4_ = auVar100._0_4_ * (float)local_4e0._0_4_;
        auVar203._4_4_ = auVar100._4_4_ * (float)local_4e0._4_4_;
        auVar203._8_4_ = auVar100._8_4_ * fStack_4d8;
        auVar203._12_4_ = auVar100._12_4_ * fStack_4d4;
        auVar203._16_4_ = auVar100._16_4_ * fStack_4d0;
        auVar203._20_4_ = auVar100._20_4_ * fStack_4cc;
        auVar203._28_36_ = auVar195._28_36_;
        auVar203._24_4_ = auVar100._24_4_ * fStack_4c8;
        auVar88 = vmulps_avx512vl(local_e0,auVar100);
        auVar89 = vfmadd231ps_avx512vl(auVar226._0_32_,auVar101,local_480);
        auVar99 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar101,local_4a0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,local_440);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_460);
        auVar98 = vfmadd231ps_avx512vl(auVar88,auVar104,local_a0);
        auVar87 = vfmadd231ps_fma(auVar89,auVar103,local_400);
        auVar203 = ZEXT1664(auVar87);
        auVar82 = vfmadd231ps_fma(auVar99,auVar103,local_420);
        auVar195 = ZEXT1664(auVar82);
        auVar88 = *(undefined1 (*) [32])(bspline_basis1 + lVar67 * 4 + lVar22);
        auVar89 = *(undefined1 (*) [32])(lVar22 + 0x21b13cc + lVar67 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar98,auVar103,local_80);
        auVar99 = *(undefined1 (*) [32])(lVar22 + 0x21b1850 + lVar67 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21b1cd4 + lVar67 * 4);
        auVar214._0_4_ = auVar98._0_4_ * (float)local_4c0._0_4_;
        auVar214._4_4_ = auVar98._4_4_ * (float)local_4c0._4_4_;
        auVar214._8_4_ = auVar98._8_4_ * fStack_4b8;
        auVar214._12_4_ = auVar98._12_4_ * fStack_4b4;
        auVar214._16_4_ = auVar98._16_4_ * fStack_4b0;
        auVar214._20_4_ = auVar98._20_4_ * fStack_4ac;
        auVar214._28_36_ = auVar207._28_36_;
        auVar214._24_4_ = auVar98._24_4_ * fStack_4a8;
        auVar38._4_4_ = auVar98._4_4_ * (float)local_4e0._4_4_;
        auVar38._0_4_ = auVar98._0_4_ * (float)local_4e0._0_4_;
        auVar38._8_4_ = auVar98._8_4_ * fStack_4d8;
        auVar38._12_4_ = auVar98._12_4_ * fStack_4d4;
        auVar38._16_4_ = auVar98._16_4_ * fStack_4d0;
        auVar38._20_4_ = auVar98._20_4_ * fStack_4cc;
        auVar38._24_4_ = auVar98._24_4_ * fStack_4c8;
        auVar38._28_4_ = uStack_4c4;
        auVar90 = vmulps_avx512vl(local_e0,auVar98);
        auVar91 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar99,local_480);
        auVar93 = vfmadd231ps_avx512vl(auVar38,auVar99,local_4a0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_440);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_460);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,local_a0);
        auVar83 = vfmadd231ps_fma(auVar91,auVar88,local_400);
        auVar207 = ZEXT1664(auVar83);
        auVar81 = vfmadd231ps_fma(auVar93,auVar88,local_420);
        auVar93 = vfmadd231ps_avx512vl(auVar90,auVar88,local_80);
        auVar94 = vmaxps_avx512vl(auVar92,auVar93);
        auVar90 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar87));
        auVar91 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar82));
        auVar95 = vmulps_avx512vl(ZEXT1632(auVar82),auVar90);
        auVar96 = vmulps_avx512vl(ZEXT1632(auVar87),auVar91);
        auVar95 = vsubps_avx512vl(auVar95,auVar96);
        auVar96 = vmulps_avx512vl(auVar91,auVar91);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,auVar90);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar94,auVar96);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar156 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar71 = (byte)uVar21 & (byte)uVar156;
        if (bVar71 != 0) {
          auVar98 = vmulps_avx512vl(local_280,auVar98);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_260,auVar98);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_240,auVar99);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_5c0,auVar89);
          auVar100 = vmulps_avx512vl(local_280,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_260,auVar100);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_240,auVar101);
          auVar89 = vfmadd213ps_avx512vl(auVar103,local_5c0,auVar104);
          auVar103 = *(undefined1 (*) [32])(lVar22 + 0x21afd38 + lVar67 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21b01bc + lVar67 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar22 + 0x21b0640 + lVar67 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar22 + 0x21b0ac4 + lVar67 * 4);
          auVar99 = vmulps_avx512vl(_local_4c0,auVar100);
          auVar98 = vmulps_avx512vl(_local_4e0,auVar100);
          auVar100 = vmulps_avx512vl(local_280,auVar100);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_480);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_4a0);
          auVar101 = vfmadd231ps_avx512vl(auVar100,local_260,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar99,auVar104,local_440);
          auVar99 = vfmadd231ps_avx512vl(auVar98,auVar104,local_460);
          auVar104 = vfmadd231ps_avx512vl(auVar101,local_240,auVar104);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_400);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_420);
          auVar80 = vfmadd231ps_fma(auVar104,auVar103,local_5c0);
          auVar103 = *(undefined1 (*) [32])(lVar22 + 0x21b2158 + lVar67 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21b2a60 + lVar67 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar22 + 0x21b2ee4 + lVar67 * 4);
          auVar98 = vmulps_avx512vl(_local_4c0,auVar101);
          auVar94 = vmulps_avx512vl(_local_4e0,auVar101);
          auVar101 = vmulps_avx512vl(local_280,auVar101);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_480);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar104,local_4a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_260,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21b25dc + lVar67 * 4);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_440);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar104,local_460);
          auVar104 = vfmadd231ps_avx512vl(auVar101,local_240,auVar104);
          auVar101 = vfmadd231ps_avx512vl(auVar98,auVar103,local_400);
          auVar98 = vfmadd231ps_avx512vl(auVar94,auVar103,local_420);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_5c0,auVar103);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar100,auVar94);
          vandps_avx512vl(auVar99,auVar94);
          auVar103 = vmaxps_avx(auVar94,auVar94);
          vandps_avx512vl(ZEXT1632(auVar80),auVar94);
          auVar103 = vmaxps_avx(auVar103,auVar94);
          uVar63 = vcmpps_avx512vl(auVar103,_local_540,1);
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar117._0_4_ = (float)((uint)bVar11 * auVar90._0_4_ | (uint)!bVar11 * auVar100._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar11 * auVar90._4_4_ | (uint)!bVar11 * auVar100._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar11 * auVar90._8_4_ | (uint)!bVar11 * auVar100._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar11 * auVar90._12_4_ | (uint)!bVar11 * auVar100._12_4_)
          ;
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar11 * auVar90._16_4_ | (uint)!bVar11 * auVar100._16_4_)
          ;
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar11 * auVar90._20_4_ | (uint)!bVar11 * auVar100._20_4_)
          ;
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar11 * auVar90._24_4_ | (uint)!bVar11 * auVar100._24_4_)
          ;
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar117._28_4_ = (uint)bVar11 * auVar90._28_4_ | (uint)!bVar11 * auVar100._28_4_;
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar118._0_4_ = (float)((uint)bVar11 * auVar91._0_4_ | (uint)!bVar11 * auVar99._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar99._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar99._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar99._12_4_);
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar11 * auVar91._16_4_ | (uint)!bVar11 * auVar99._16_4_);
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar11 * auVar91._20_4_ | (uint)!bVar11 * auVar99._20_4_);
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar11 * auVar91._24_4_ | (uint)!bVar11 * auVar99._24_4_);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar118._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar99._28_4_;
          vandps_avx512vl(auVar101,auVar94);
          vandps_avx512vl(auVar98,auVar94);
          auVar103 = vmaxps_avx(auVar118,auVar118);
          vandps_avx512vl(auVar104,auVar94);
          auVar103 = vmaxps_avx(auVar103,auVar118);
          uVar63 = vcmpps_avx512vl(auVar103,_local_540,1);
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar119._0_4_ = (uint)bVar11 * auVar90._0_4_ | (uint)!bVar11 * auVar101._0_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar11 * auVar90._4_4_ | (uint)!bVar11 * auVar101._4_4_;
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar11 * auVar90._8_4_ | (uint)!bVar11 * auVar101._8_4_;
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar11 * auVar90._12_4_ | (uint)!bVar11 * auVar101._12_4_;
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar119._16_4_ = (uint)bVar11 * auVar90._16_4_ | (uint)!bVar11 * auVar101._16_4_;
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar119._20_4_ = (uint)bVar11 * auVar90._20_4_ | (uint)!bVar11 * auVar101._20_4_;
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar119._24_4_ = (uint)bVar11 * auVar90._24_4_ | (uint)!bVar11 * auVar101._24_4_;
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar119._28_4_ = (uint)bVar11 * auVar90._28_4_ | (uint)!bVar11 * auVar101._28_4_;
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar120._0_4_ = (float)((uint)bVar11 * auVar91._0_4_ | (uint)!bVar11 * auVar98._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar98._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar98._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar98._12_4_);
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar11 * auVar91._16_4_ | (uint)!bVar11 * auVar98._16_4_);
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar11 * auVar91._20_4_ | (uint)!bVar11 * auVar98._20_4_);
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar11 * auVar91._24_4_ | (uint)!bVar11 * auVar98._24_4_);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar120._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar98._28_4_;
          auVar213._8_4_ = 0x80000000;
          auVar213._0_8_ = 0x8000000080000000;
          auVar213._12_4_ = 0x80000000;
          auVar213._16_4_ = 0x80000000;
          auVar213._20_4_ = 0x80000000;
          auVar213._24_4_ = 0x80000000;
          auVar213._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar119,auVar213);
          auVar86 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
          auVar104 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar86));
          auVar80 = vfmadd231ps_fma(auVar104,auVar118,auVar118);
          auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
          auVar223._8_4_ = 0xbf000000;
          auVar223._0_8_ = 0xbf000000bf000000;
          auVar223._12_4_ = 0xbf000000;
          auVar223._16_4_ = 0xbf000000;
          auVar223._20_4_ = 0xbf000000;
          auVar223._24_4_ = 0xbf000000;
          auVar223._28_4_ = 0xbf000000;
          fVar138 = auVar104._0_4_;
          fVar161 = auVar104._4_4_;
          fVar209 = auVar104._8_4_;
          fVar210 = auVar104._12_4_;
          fVar173 = auVar104._16_4_;
          fVar172 = auVar104._20_4_;
          fVar181 = auVar104._24_4_;
          auVar39._4_4_ = fVar161 * fVar161 * fVar161 * auVar80._4_4_ * -0.5;
          auVar39._0_4_ = fVar138 * fVar138 * fVar138 * auVar80._0_4_ * -0.5;
          auVar39._8_4_ = fVar209 * fVar209 * fVar209 * auVar80._8_4_ * -0.5;
          auVar39._12_4_ = fVar210 * fVar210 * fVar210 * auVar80._12_4_ * -0.5;
          auVar39._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar39._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar39._24_4_ = fVar181 * fVar181 * fVar181 * -0.0;
          auVar39._28_4_ = auVar118._28_4_;
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar104 = vfmadd231ps_avx512vl(auVar39,auVar101,auVar104);
          auVar40._4_4_ = auVar118._4_4_ * auVar104._4_4_;
          auVar40._0_4_ = auVar118._0_4_ * auVar104._0_4_;
          auVar40._8_4_ = auVar118._8_4_ * auVar104._8_4_;
          auVar40._12_4_ = auVar118._12_4_ * auVar104._12_4_;
          auVar40._16_4_ = auVar118._16_4_ * auVar104._16_4_;
          auVar40._20_4_ = auVar118._20_4_ * auVar104._20_4_;
          auVar40._24_4_ = auVar118._24_4_ * auVar104._24_4_;
          auVar40._28_4_ = 0;
          auVar41._4_4_ = auVar104._4_4_ * -auVar117._4_4_;
          auVar41._0_4_ = auVar104._0_4_ * -auVar117._0_4_;
          auVar41._8_4_ = auVar104._8_4_ * -auVar117._8_4_;
          auVar41._12_4_ = auVar104._12_4_ * -auVar117._12_4_;
          auVar41._16_4_ = auVar104._16_4_ * -auVar117._16_4_;
          auVar41._20_4_ = auVar104._20_4_ * -auVar117._20_4_;
          auVar41._24_4_ = auVar104._24_4_ * -auVar117._24_4_;
          auVar41._28_4_ = auVar118._28_4_;
          auVar100 = vmulps_avx512vl(auVar104,ZEXT1632(auVar86));
          auVar98 = ZEXT1632(auVar86);
          auVar104 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar98);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar120,auVar120);
          auVar99 = vrsqrt14ps_avx512vl(auVar104);
          auVar104 = vmulps_avx512vl(auVar104,auVar223);
          fVar138 = auVar99._0_4_;
          fVar161 = auVar99._4_4_;
          fVar209 = auVar99._8_4_;
          fVar210 = auVar99._12_4_;
          fVar173 = auVar99._16_4_;
          fVar172 = auVar99._20_4_;
          fVar181 = auVar99._24_4_;
          auVar42._4_4_ = fVar161 * fVar161 * fVar161 * auVar104._4_4_;
          auVar42._0_4_ = fVar138 * fVar138 * fVar138 * auVar104._0_4_;
          auVar42._8_4_ = fVar209 * fVar209 * fVar209 * auVar104._8_4_;
          auVar42._12_4_ = fVar210 * fVar210 * fVar210 * auVar104._12_4_;
          auVar42._16_4_ = fVar173 * fVar173 * fVar173 * auVar104._16_4_;
          auVar42._20_4_ = fVar172 * fVar172 * fVar172 * auVar104._20_4_;
          auVar42._24_4_ = fVar181 * fVar181 * fVar181 * auVar104._24_4_;
          auVar42._28_4_ = auVar104._28_4_;
          auVar104 = vfmadd231ps_avx512vl(auVar42,auVar101,auVar99);
          auVar43._4_4_ = auVar120._4_4_ * auVar104._4_4_;
          auVar43._0_4_ = auVar120._0_4_ * auVar104._0_4_;
          auVar43._8_4_ = auVar120._8_4_ * auVar104._8_4_;
          auVar43._12_4_ = auVar120._12_4_ * auVar104._12_4_;
          auVar43._16_4_ = auVar120._16_4_ * auVar104._16_4_;
          auVar43._20_4_ = auVar120._20_4_ * auVar104._20_4_;
          auVar43._24_4_ = auVar120._24_4_ * auVar104._24_4_;
          auVar43._28_4_ = auVar99._28_4_;
          auVar44._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar44._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar44._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar44._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar44._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar44._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar44._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar44._28_4_ = auVar103._28_4_;
          auVar103 = vmulps_avx512vl(auVar104,auVar98);
          auVar80 = vfmadd213ps_fma(auVar40,auVar92,ZEXT1632(auVar87));
          auVar19 = vfmadd213ps_fma(auVar41,auVar92,ZEXT1632(auVar82));
          auVar101 = vfmadd213ps_avx512vl(auVar100,auVar92,auVar89);
          auVar99 = vfmadd213ps_avx512vl(auVar43,auVar93,ZEXT1632(auVar83));
          auVar79 = vfnmadd213ps_fma(auVar40,auVar92,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar44,auVar93,ZEXT1632(auVar81));
          auVar78 = vfnmadd213ps_fma(auVar41,auVar92,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar103,auVar93,auVar88);
          auVar140 = vfnmadd231ps_fma(auVar89,auVar92,auVar100);
          auVar77 = vfnmadd213ps_fma(auVar43,auVar93,ZEXT1632(auVar83));
          auVar84 = vfnmadd213ps_fma(auVar44,auVar93,ZEXT1632(auVar81));
          auVar85 = vfnmadd231ps_fma(auVar88,auVar93,auVar103);
          auVar88 = vsubps_avx512vl(auVar99,ZEXT1632(auVar79));
          auVar103 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar78));
          auVar104 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar140));
          auVar45._4_4_ = auVar103._4_4_ * auVar140._4_4_;
          auVar45._0_4_ = auVar103._0_4_ * auVar140._0_4_;
          auVar45._8_4_ = auVar103._8_4_ * auVar140._8_4_;
          auVar45._12_4_ = auVar103._12_4_ * auVar140._12_4_;
          auVar45._16_4_ = auVar103._16_4_ * 0.0;
          auVar45._20_4_ = auVar103._20_4_ * 0.0;
          auVar45._24_4_ = auVar103._24_4_ * 0.0;
          auVar45._28_4_ = auVar100._28_4_;
          auVar83 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar78),auVar104);
          auVar46._4_4_ = auVar104._4_4_ * auVar79._4_4_;
          auVar46._0_4_ = auVar104._0_4_ * auVar79._0_4_;
          auVar46._8_4_ = auVar104._8_4_ * auVar79._8_4_;
          auVar46._12_4_ = auVar104._12_4_ * auVar79._12_4_;
          auVar46._16_4_ = auVar104._16_4_ * 0.0;
          auVar46._20_4_ = auVar104._20_4_ * 0.0;
          auVar46._24_4_ = auVar104._24_4_ * 0.0;
          auVar46._28_4_ = auVar104._28_4_;
          auVar81 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar140),auVar88);
          auVar47._4_4_ = auVar78._4_4_ * auVar88._4_4_;
          auVar47._0_4_ = auVar78._0_4_ * auVar88._0_4_;
          auVar47._8_4_ = auVar78._8_4_ * auVar88._8_4_;
          auVar47._12_4_ = auVar78._12_4_ * auVar88._12_4_;
          auVar47._16_4_ = auVar88._16_4_ * 0.0;
          auVar47._20_4_ = auVar88._20_4_ * 0.0;
          auVar47._24_4_ = auVar88._24_4_ * 0.0;
          auVar47._28_4_ = auVar88._28_4_;
          auVar20 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar79),auVar103);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar98,ZEXT1632(auVar81));
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,ZEXT1632(auVar83));
          auVar95 = ZEXT1632(auVar86);
          uVar63 = vcmpps_avx512vl(auVar103,auVar95,2);
          bVar62 = (byte)uVar63;
          fVar130 = (float)((uint)(bVar62 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar62 & 1) * auVar77._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar132 = (float)((uint)bVar11 * auVar80._4_4_ | (uint)!bVar11 * auVar77._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar134 = (float)((uint)bVar11 * auVar80._8_4_ | (uint)!bVar11 * auVar77._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar136 = (float)((uint)bVar11 * auVar80._12_4_ | (uint)!bVar11 * auVar77._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar130))));
          fVar131 = (float)((uint)(bVar62 & 1) * auVar19._0_4_ |
                           (uint)!(bool)(bVar62 & 1) * auVar84._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar133 = (float)((uint)bVar11 * auVar19._4_4_ | (uint)!bVar11 * auVar84._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar135 = (float)((uint)bVar11 * auVar19._8_4_ | (uint)!bVar11 * auVar84._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar137 = (float)((uint)bVar11 * auVar19._12_4_ | (uint)!bVar11 * auVar84._12_4_);
          auVar90 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar131))));
          auVar121._0_4_ =
               (float)((uint)(bVar62 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar85._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar85._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar85._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar85._12_4_)
          ;
          fVar209 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
          auVar121._16_4_ = fVar209;
          fVar161 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
          auVar121._20_4_ = fVar161;
          fVar138 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
          auVar121._24_4_ = fVar138;
          iVar1 = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
          auVar121._28_4_ = iVar1;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar99);
          auVar122._0_4_ =
               (uint)(bVar62 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar83._0_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * auVar83._4_4_;
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * auVar83._8_4_;
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * auVar83._12_4_;
          auVar122._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar103._16_4_;
          auVar122._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar103._20_4_;
          auVar122._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar103._24_4_;
          auVar122._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar87));
          auVar123._0_4_ =
               (float)((uint)(bVar62 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar80._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * auVar80._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * auVar80._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * auVar80._12_4_)
          ;
          fVar210 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar103._16_4_);
          auVar123._16_4_ = fVar210;
          fVar173 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar103._20_4_);
          auVar123._20_4_ = fVar173;
          fVar172 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar103._24_4_);
          auVar123._24_4_ = fVar172;
          auVar123._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar140),ZEXT1632(auVar82));
          auVar124._0_4_ =
               (float)((uint)(bVar62 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar19._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * auVar19._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * auVar19._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * auVar19._12_4_)
          ;
          fVar74 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar103._16_4_);
          auVar124._16_4_ = fVar74;
          fVar73 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar103._20_4_);
          auVar124._20_4_ = fVar73;
          fVar181 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar103._24_4_);
          auVar124._24_4_ = fVar181;
          iVar2 = (uint)(byte)(uVar63 >> 7) * auVar103._28_4_;
          auVar124._28_4_ = iVar2;
          auVar125._0_4_ =
               (uint)(bVar62 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar11 * (int)auVar79._4_4_ | (uint)!bVar11 * auVar99._4_4_;
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar11 * (int)auVar79._8_4_ | (uint)!bVar11 * auVar99._8_4_;
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar11 * (int)auVar79._12_4_ | (uint)!bVar11 * auVar99._12_4_;
          auVar125._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_;
          auVar125._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_;
          auVar125._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_;
          auVar125._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar99._28_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar99 = vsubps_avx512vl(auVar125,auVar98);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar78._12_4_ |
                                                   (uint)!bVar15 * auVar87._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar78._8_4_ |
                                                            (uint)!bVar13 * auVar87._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar78._4_4_ |
                                                                     (uint)!bVar11 * auVar87._4_4_,
                                                                     (uint)(bVar62 & 1) *
                                                                     (int)auVar78._0_4_ |
                                                                     (uint)!(bool)(bVar62 & 1) *
                                                                     auVar87._0_4_)))),auVar90);
          auVar203 = ZEXT3264(auVar104);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar140._12_4_ |
                                                   (uint)!bVar16 * auVar82._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar140._8_4_ |
                                                            (uint)!bVar14 * auVar82._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar140._4_4_ |
                                                                     (uint)!bVar12 * auVar82._4_4_,
                                                                     (uint)(bVar62 & 1) *
                                                                     (int)auVar140._0_4_ |
                                                                     (uint)!(bool)(bVar62 & 1) *
                                                                     auVar82._0_4_)))),auVar121);
          auVar100 = vsubps_avx(auVar98,auVar122);
          auVar207 = ZEXT3264(auVar100);
          auVar88 = vsubps_avx(auVar90,auVar123);
          auVar89 = vsubps_avx(auVar121,auVar124);
          auVar48._4_4_ = auVar101._4_4_ * fVar132;
          auVar48._0_4_ = auVar101._0_4_ * fVar130;
          auVar48._8_4_ = auVar101._8_4_ * fVar134;
          auVar48._12_4_ = auVar101._12_4_ * fVar136;
          auVar48._16_4_ = auVar101._16_4_ * 0.0;
          auVar48._20_4_ = auVar101._20_4_ * 0.0;
          auVar48._24_4_ = auVar101._24_4_ * 0.0;
          auVar48._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar48,auVar121,auVar99);
          auVar179._0_4_ = fVar131 * auVar99._0_4_;
          auVar179._4_4_ = fVar133 * auVar99._4_4_;
          auVar179._8_4_ = fVar135 * auVar99._8_4_;
          auVar179._12_4_ = fVar137 * auVar99._12_4_;
          auVar179._16_4_ = auVar99._16_4_ * 0.0;
          auVar179._20_4_ = auVar99._20_4_ * 0.0;
          auVar179._24_4_ = auVar99._24_4_ * 0.0;
          auVar179._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar179,auVar98,auVar104);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar95,ZEXT1632(auVar87));
          auVar192._0_4_ = auVar104._0_4_ * auVar121._0_4_;
          auVar192._4_4_ = auVar104._4_4_ * auVar121._4_4_;
          auVar192._8_4_ = auVar104._8_4_ * auVar121._8_4_;
          auVar192._12_4_ = auVar104._12_4_ * auVar121._12_4_;
          auVar192._16_4_ = auVar104._16_4_ * fVar209;
          auVar192._20_4_ = auVar104._20_4_ * fVar161;
          auVar192._24_4_ = auVar104._24_4_ * fVar138;
          auVar192._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar192,auVar90,auVar101);
          auVar91 = vfmadd231ps_avx512vl(auVar103,auVar95,ZEXT1632(auVar87));
          auVar103 = vmulps_avx512vl(auVar89,auVar122);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar100,auVar124);
          auVar49._4_4_ = auVar88._4_4_ * auVar124._4_4_;
          auVar49._0_4_ = auVar88._0_4_ * auVar124._0_4_;
          auVar49._8_4_ = auVar88._8_4_ * auVar124._8_4_;
          auVar49._12_4_ = auVar88._12_4_ * auVar124._12_4_;
          auVar49._16_4_ = auVar88._16_4_ * fVar74;
          auVar49._20_4_ = auVar88._20_4_ * fVar73;
          auVar49._24_4_ = auVar88._24_4_ * fVar181;
          auVar49._28_4_ = iVar2;
          auVar87 = vfmsub231ps_fma(auVar49,auVar123,auVar89);
          auVar193._0_4_ = auVar123._0_4_ * auVar100._0_4_;
          auVar193._4_4_ = auVar123._4_4_ * auVar100._4_4_;
          auVar193._8_4_ = auVar123._8_4_ * auVar100._8_4_;
          auVar193._12_4_ = auVar123._12_4_ * auVar100._12_4_;
          auVar193._16_4_ = fVar210 * auVar100._16_4_;
          auVar193._20_4_ = fVar173 * auVar100._20_4_;
          auVar193._24_4_ = fVar172 * auVar100._24_4_;
          auVar193._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar193,auVar88,auVar122);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar95,auVar103);
          auVar94 = vfmadd231ps_avx512vl(auVar103,auVar95,ZEXT1632(auVar87));
          auVar195 = ZEXT3264(auVar94);
          auVar103 = vmaxps_avx(auVar91,auVar94);
          uVar156 = vcmpps_avx512vl(auVar103,auVar95,2);
          bVar71 = bVar71 & (byte)uVar156;
          if (bVar71 != 0) {
            uVar139 = *(undefined4 *)(ray + sVar69 * 4 + 0x100);
            auVar224._4_4_ = uVar139;
            auVar224._0_4_ = uVar139;
            auVar224._8_4_ = uVar139;
            auVar224._12_4_ = uVar139;
            auVar224._16_4_ = uVar139;
            auVar224._20_4_ = uVar139;
            auVar224._24_4_ = uVar139;
            auVar224._28_4_ = uVar139;
            auVar214 = ZEXT3264(auVar224);
            auVar50._4_4_ = auVar89._4_4_ * auVar104._4_4_;
            auVar50._0_4_ = auVar89._0_4_ * auVar104._0_4_;
            auVar50._8_4_ = auVar89._8_4_ * auVar104._8_4_;
            auVar50._12_4_ = auVar89._12_4_ * auVar104._12_4_;
            auVar50._16_4_ = auVar89._16_4_ * auVar104._16_4_;
            auVar50._20_4_ = auVar89._20_4_ * auVar104._20_4_;
            auVar50._24_4_ = auVar89._24_4_ * auVar104._24_4_;
            auVar50._28_4_ = auVar103._28_4_;
            auVar81 = vfmsub231ps_fma(auVar50,auVar88,auVar101);
            auVar51._4_4_ = auVar101._4_4_ * auVar100._4_4_;
            auVar51._0_4_ = auVar101._0_4_ * auVar100._0_4_;
            auVar51._8_4_ = auVar101._8_4_ * auVar100._8_4_;
            auVar51._12_4_ = auVar101._12_4_ * auVar100._12_4_;
            auVar51._16_4_ = auVar101._16_4_ * auVar100._16_4_;
            auVar51._20_4_ = auVar101._20_4_ * auVar100._20_4_;
            auVar51._24_4_ = auVar101._24_4_ * auVar100._24_4_;
            auVar51._28_4_ = auVar101._28_4_;
            auVar83 = vfmsub231ps_fma(auVar51,auVar99,auVar89);
            auVar52._4_4_ = auVar88._4_4_ * auVar99._4_4_;
            auVar52._0_4_ = auVar88._0_4_ * auVar99._0_4_;
            auVar52._8_4_ = auVar88._8_4_ * auVar99._8_4_;
            auVar52._12_4_ = auVar88._12_4_ * auVar99._12_4_;
            auVar52._16_4_ = auVar88._16_4_ * auVar99._16_4_;
            auVar52._20_4_ = auVar88._20_4_ * auVar99._20_4_;
            auVar52._24_4_ = auVar88._24_4_ * auVar99._24_4_;
            auVar52._28_4_ = auVar88._28_4_;
            auVar80 = vfmsub231ps_fma(auVar52,auVar100,auVar104);
            auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar80));
            auVar82 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar81),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
            auVar207 = ZEXT3264(auVar103);
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = 0x3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar30._16_4_ = 0x3f800000;
            auVar30._20_4_ = 0x3f800000;
            auVar30._24_4_ = 0x3f800000;
            auVar30._28_4_ = 0x3f800000;
            auVar104 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar82),auVar30);
            auVar87 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
            auVar203 = ZEXT1664(auVar87);
            auVar53._4_4_ = auVar80._4_4_ * auVar121._4_4_;
            auVar53._0_4_ = auVar80._0_4_ * auVar121._0_4_;
            auVar53._8_4_ = auVar80._8_4_ * auVar121._8_4_;
            auVar53._12_4_ = auVar80._12_4_ * auVar121._12_4_;
            auVar53._16_4_ = fVar209 * 0.0;
            auVar53._20_4_ = fVar161 * 0.0;
            auVar53._24_4_ = fVar138 * 0.0;
            auVar53._28_4_ = iVar1;
            auVar83 = vfmadd231ps_fma(auVar53,auVar90,ZEXT1632(auVar83));
            auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar98,ZEXT1632(auVar81));
            fVar138 = auVar87._0_4_;
            fVar161 = auVar87._4_4_;
            fVar209 = auVar87._8_4_;
            fVar210 = auVar87._12_4_;
            local_3a0 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar210,
                                           CONCAT48(auVar83._8_4_ * fVar209,
                                                    CONCAT44(auVar83._4_4_ * fVar161,
                                                             auVar83._0_4_ * fVar138))));
            auVar226 = ZEXT3264(local_3a0);
            uVar156 = vcmpps_avx512vl(local_3a0,auVar224,2);
            uVar21 = vcmpps_avx512vl(local_3a0,local_500,0xd);
            bVar71 = (byte)uVar156 & (byte)uVar21 & bVar71;
            if (bVar71 != 0) {
              uVar72 = vcmpps_avx512vl(ZEXT1632(auVar82),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar72 = bVar71 & uVar72;
              if ((char)uVar72 != '\0') {
                fVar173 = auVar91._0_4_ * fVar138;
                fVar172 = auVar91._4_4_ * fVar161;
                auVar54._4_4_ = fVar172;
                auVar54._0_4_ = fVar173;
                fVar181 = auVar91._8_4_ * fVar209;
                auVar54._8_4_ = fVar181;
                fVar73 = auVar91._12_4_ * fVar210;
                auVar54._12_4_ = fVar73;
                fVar74 = auVar91._16_4_ * 0.0;
                auVar54._16_4_ = fVar74;
                fVar130 = auVar91._20_4_ * 0.0;
                auVar54._20_4_ = fVar130;
                fVar131 = auVar91._24_4_ * 0.0;
                auVar54._24_4_ = fVar131;
                auVar54._28_4_ = auVar91._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar171,auVar54);
                local_3e0._0_4_ =
                     (uint)(bVar62 & 1) * (int)fVar173 | (uint)!(bool)(bVar62 & 1) * auVar103._0_4_;
                bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                local_3e0._4_4_ = (uint)bVar11 * (int)fVar172 | (uint)!bVar11 * auVar103._4_4_;
                bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
                local_3e0._8_4_ = (uint)bVar11 * (int)fVar181 | (uint)!bVar11 * auVar103._8_4_;
                bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
                local_3e0._12_4_ = (uint)bVar11 * (int)fVar73 | (uint)!bVar11 * auVar103._12_4_;
                bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
                local_3e0._16_4_ = (uint)bVar11 * (int)fVar74 | (uint)!bVar11 * auVar103._16_4_;
                bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
                local_3e0._20_4_ = (uint)bVar11 * (int)fVar130 | (uint)!bVar11 * auVar103._20_4_;
                bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                local_3e0._24_4_ = (uint)bVar11 * (int)fVar131 | (uint)!bVar11 * auVar103._24_4_;
                bVar11 = SUB81(uVar63 >> 7,0);
                local_3e0._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar103._28_4_;
                auVar103 = vsubps_avx(auVar93,auVar92);
                auVar87 = vfmadd213ps_fma(auVar103,local_3e0,auVar92);
                uVar139 = *(undefined4 *)((long)pre->ray_space + sVar69 * 4 + -0x20);
                auVar31._4_4_ = uVar139;
                auVar31._0_4_ = uVar139;
                auVar31._8_4_ = uVar139;
                auVar31._12_4_ = uVar139;
                auVar31._16_4_ = uVar139;
                auVar31._20_4_ = uVar139;
                auVar31._24_4_ = uVar139;
                auVar31._28_4_ = uVar139;
                auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                              CONCAT48(auVar87._8_4_ + auVar87._8_4_
                                                                       ,CONCAT44(auVar87._4_4_ +
                                                                                 auVar87._4_4_,
                                                                                 auVar87._0_4_ +
                                                                                 auVar87._0_4_)))),
                                           auVar31);
                uVar66 = vcmpps_avx512vl(local_3a0,auVar103,6);
                uVar72 = uVar72 & uVar66;
                bVar71 = (byte)uVar72;
                if (bVar71 != 0) {
                  auVar160._0_4_ = auVar94._0_4_ * fVar138;
                  auVar160._4_4_ = auVar94._4_4_ * fVar161;
                  auVar160._8_4_ = auVar94._8_4_ * fVar209;
                  auVar160._12_4_ = auVar94._12_4_ * fVar210;
                  auVar160._16_4_ = auVar94._16_4_ * 0.0;
                  auVar160._20_4_ = auVar94._20_4_ * 0.0;
                  auVar160._24_4_ = auVar94._24_4_ * 0.0;
                  auVar160._28_4_ = 0;
                  auVar180._8_4_ = 0x3f800000;
                  auVar180._0_8_ = 0x3f8000003f800000;
                  auVar180._12_4_ = 0x3f800000;
                  auVar180._16_4_ = 0x3f800000;
                  auVar180._20_4_ = 0x3f800000;
                  auVar180._24_4_ = 0x3f800000;
                  auVar180._28_4_ = 0x3f800000;
                  auVar103 = vsubps_avx(auVar180,auVar160);
                  auVar126._0_4_ =
                       (uint)(bVar62 & 1) * (int)auVar160._0_4_ |
                       (uint)!(bool)(bVar62 & 1) * auVar103._0_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar11 * (int)auVar160._4_4_ | (uint)!bVar11 * auVar103._4_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar11 * (int)auVar160._8_4_ | (uint)!bVar11 * auVar103._8_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar11 * (int)auVar160._12_4_ | (uint)!bVar11 * auVar103._12_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
                  auVar126._16_4_ =
                       (uint)bVar11 * (int)auVar160._16_4_ | (uint)!bVar11 * auVar103._16_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
                  auVar126._20_4_ =
                       (uint)bVar11 * (int)auVar160._20_4_ | (uint)!bVar11 * auVar103._20_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                  auVar126._24_4_ =
                       (uint)bVar11 * (int)auVar160._24_4_ | (uint)!bVar11 * auVar103._24_4_;
                  auVar126._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar103._28_4_;
                  auVar32._8_4_ = 0x40000000;
                  auVar32._0_8_ = 0x4000000040000000;
                  auVar32._12_4_ = 0x40000000;
                  auVar32._16_4_ = 0x40000000;
                  auVar32._20_4_ = 0x40000000;
                  auVar32._24_4_ = 0x40000000;
                  auVar32._28_4_ = 0x40000000;
                  local_3c0 = vfmsub132ps_avx512vl(auVar126,auVar180,auVar32);
                  local_380 = (undefined4)lVar67;
                  local_360 = local_660;
                  uStack_358 = uStack_658;
                  local_350 = local_670;
                  uStack_348 = uStack_668;
                  local_340 = local_680;
                  uStack_338 = uStack_678;
                  pGVar9 = (context->scene->geometries).items[uVar68].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + sVar69 * 4 + 0x120)) != 0) {
                    auVar103 = vaddps_avx512vl(local_3e0,auVar229._0_32_);
                    auVar87 = vcvtsi2ss_avx512f(auVar86,local_380);
                    fVar138 = auVar87._0_4_;
                    local_320[0] = (fVar138 + auVar103._0_4_) * local_100;
                    local_320[1] = (fVar138 + auVar103._4_4_) * fStack_fc;
                    local_320[2] = (fVar138 + auVar103._8_4_) * fStack_f8;
                    local_320[3] = (fVar138 + auVar103._12_4_) * fStack_f4;
                    fStack_310 = (fVar138 + auVar103._16_4_) * fStack_f0;
                    fStack_30c = (fVar138 + auVar103._20_4_) * fStack_ec;
                    fStack_308 = (fVar138 + auVar103._24_4_) * fStack_e8;
                    fStack_304 = fVar138 + auVar103._28_4_;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    auVar148._8_4_ = 0x7f800000;
                    auVar148._0_8_ = 0x7f8000007f800000;
                    auVar148._12_4_ = 0x7f800000;
                    auVar148._16_4_ = 0x7f800000;
                    auVar148._20_4_ = 0x7f800000;
                    auVar148._24_4_ = 0x7f800000;
                    auVar148._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar148,local_3a0);
                    auVar127._0_4_ =
                         (uint)(bVar71 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar127._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar127._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar127._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar127._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar127._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar127._24_4_ = (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = SUB81(uVar72 >> 7,0);
                    auVar127._28_4_ = (uint)bVar11 * auVar103._28_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar103 = vshufps_avx(auVar127,auVar127,0xb1);
                    auVar103 = vminps_avx(auVar127,auVar103);
                    auVar104 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar104);
                    auVar104 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar104);
                    uVar156 = vcmpps_avx512vl(auVar127,auVar103,0);
                    uVar64 = (uint)uVar72;
                    if (((byte)uVar156 & bVar71) != 0) {
                      uVar64 = (uint)((byte)uVar156 & bVar71);
                    }
                    uVar65 = 0;
                    for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
                      uVar65 = uVar65 + 1;
                    }
                    uVar63 = (ulong)uVar65;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_2c0 = local_3a0;
                      local_37c = iVar7;
                      local_370 = auVar75;
                      do {
                        fVar138 = local_320[uVar63];
                        auVar158._4_4_ = fVar138;
                        auVar158._0_4_ = fVar138;
                        auVar158._8_4_ = fVar138;
                        auVar158._12_4_ = fVar138;
                        local_1c0._16_4_ = fVar138;
                        local_1c0._0_16_ = auVar158;
                        local_1c0._20_4_ = fVar138;
                        local_1c0._24_4_ = fVar138;
                        local_1c0._28_4_ = fVar138;
                        local_1a0 = *(undefined4 *)(local_300 + uVar63 * 4);
                        *(undefined4 *)(ray + sVar69 * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + uVar63 * 4);
                        local_650.context = context->user;
                        fVar161 = 1.0 - fVar138;
                        auVar26._8_4_ = 0x80000000;
                        auVar26._0_8_ = 0x8000000080000000;
                        auVar26._12_4_ = 0x80000000;
                        auVar83 = vxorps_avx512vl(ZEXT416((uint)fVar161),auVar26);
                        auVar87 = ZEXT416((uint)(fVar138 * fVar161 * 4.0));
                        auVar82 = vfnmsub213ss_fma(auVar158,auVar158,auVar87);
                        auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),
                                                  auVar87);
                        auVar207 = ZEXT464(0x3f000000);
                        fVar161 = fVar161 * auVar83._0_4_ * 0.5;
                        fVar209 = auVar82._0_4_ * 0.5;
                        fVar210 = auVar87._0_4_ * 0.5;
                        fVar138 = fVar138 * fVar138 * 0.5;
                        auVar197._0_4_ = fVar138 * fVar153;
                        auVar197._4_4_ = fVar138 * fVar154;
                        auVar197._8_4_ = fVar138 * fVar155;
                        auVar197._12_4_ = fVar138 * fVar61;
                        auVar141._4_4_ = fVar210;
                        auVar141._0_4_ = fVar210;
                        auVar141._8_4_ = fVar210;
                        auVar141._12_4_ = fVar210;
                        auVar87 = vfmadd132ps_fma(auVar141,auVar197,auVar18);
                        auVar188._4_4_ = fVar209;
                        auVar188._0_4_ = fVar209;
                        auVar188._8_4_ = fVar209;
                        auVar188._12_4_ = fVar209;
                        auVar87 = vfmadd132ps_fma(auVar188,auVar87,auVar76);
                        auVar142._4_4_ = fVar161;
                        auVar142._0_4_ = fVar161;
                        auVar142._8_4_ = fVar161;
                        auVar142._12_4_ = fVar161;
                        auVar87 = vfmadd213ps_fma(auVar142,auVar75,auVar87);
                        local_220 = auVar87._0_4_;
                        auVar194._8_4_ = 1;
                        auVar194._0_8_ = 0x100000001;
                        auVar194._12_4_ = 1;
                        auVar194._16_4_ = 1;
                        auVar194._20_4_ = 1;
                        auVar194._24_4_ = 1;
                        auVar194._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar194,ZEXT1632(auVar87));
                        auVar195 = ZEXT3264(local_200);
                        auVar198._8_4_ = 2;
                        auVar198._0_8_ = 0x200000002;
                        auVar198._12_4_ = 2;
                        auVar201._16_4_ = 2;
                        auVar201._0_16_ = auVar198;
                        auVar201._20_4_ = 2;
                        auVar201._24_4_ = 2;
                        auVar201._28_4_ = 2;
                        auVar203 = ZEXT3264(auVar201);
                        local_1e0 = vpermps_avx2(auVar201,ZEXT1632(auVar87));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_560._0_8_;
                        uStack_178 = local_560._8_8_;
                        uStack_170 = local_560._16_8_;
                        uStack_168 = local_560._24_8_;
                        local_160 = local_520;
                        auVar103 = vpcmpeqd_avx2(local_520,local_520);
                        local_608[1] = auVar103;
                        *local_608 = auVar103;
                        local_140 = (local_650.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_650.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_2a0;
                        local_650.valid = (int *)local_600;
                        local_650.geometryUserPtr = pGVar9->userPtr;
                        local_650.hit = (RTCHitN *)&local_220;
                        local_650.N = 8;
                        local_580 = auVar214._0_32_;
                        local_620._0_4_ = (int)uVar72;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar195 = ZEXT1664(local_200._0_16_);
                          auVar203 = ZEXT1664(auVar198);
                          auVar207 = ZEXT1664(auVar207._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_650);
                          uVar72 = (ulong)(uint)local_620._0_4_;
                          auVar226 = ZEXT3264(local_2c0);
                          auVar214 = ZEXT3264(local_580);
                        }
                        bVar71 = (byte)uVar72;
                        if (local_600 == (undefined1  [32])0x0) {
LAB_01a6bc82:
                          *(int *)(ray + sVar69 * 4 + 0x100) = auVar214._0_4_;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar195 = ZEXT1664(auVar195._0_16_);
                            auVar203 = ZEXT1664(auVar203._0_16_);
                            auVar207 = ZEXT1664(auVar207._0_16_);
                            (*p_Var10)(&local_650);
                            bVar71 = local_620[0];
                            auVar226 = ZEXT3264(local_2c0);
                            auVar214 = ZEXT3264(local_580);
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_01a6bc82;
                          uVar72 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_650.hit + 4);
                          iVar2 = *(int *)(local_650.hit + 8);
                          iVar56 = *(int *)(local_650.hit + 0xc);
                          iVar57 = *(int *)(local_650.hit + 0x10);
                          iVar58 = *(int *)(local_650.hit + 0x14);
                          iVar59 = *(int *)(local_650.hit + 0x18);
                          iVar60 = *(int *)(local_650.hit + 0x1c);
                          bVar62 = (byte)uVar72;
                          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar17 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_650.ray + 0x180) =
                               (uint)(bVar62 & 1) * *(int *)local_650.hit |
                               (uint)!(bool)(bVar62 & 1) * *(int *)(local_650.ray + 0x180);
                          *(uint *)(local_650.ray + 0x184) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x184);
                          *(uint *)(local_650.ray + 0x188) =
                               (uint)bVar12 * iVar2 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x188);
                          *(uint *)(local_650.ray + 0x18c) =
                               (uint)bVar13 * iVar56 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x18c);
                          *(uint *)(local_650.ray + 400) =
                               (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_650.ray + 400)
                          ;
                          *(uint *)(local_650.ray + 0x194) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x194);
                          *(uint *)(local_650.ray + 0x198) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x198);
                          *(uint *)(local_650.ray + 0x19c) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x19c);
                          iVar1 = *(int *)(local_650.hit + 0x24);
                          iVar2 = *(int *)(local_650.hit + 0x28);
                          iVar56 = *(int *)(local_650.hit + 0x2c);
                          iVar57 = *(int *)(local_650.hit + 0x30);
                          iVar58 = *(int *)(local_650.hit + 0x34);
                          iVar59 = *(int *)(local_650.hit + 0x38);
                          iVar60 = *(int *)(local_650.hit + 0x3c);
                          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar17 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_650.ray + 0x1a0) =
                               (uint)(bVar62 & 1) * *(int *)(local_650.hit + 0x20) |
                               (uint)!(bool)(bVar62 & 1) * *(int *)(local_650.ray + 0x1a0);
                          *(uint *)(local_650.ray + 0x1a4) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x1a4);
                          *(uint *)(local_650.ray + 0x1a8) =
                               (uint)bVar12 * iVar2 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x1a8);
                          *(uint *)(local_650.ray + 0x1ac) =
                               (uint)bVar13 * iVar56 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1ac);
                          *(uint *)(local_650.ray + 0x1b0) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1b0);
                          *(uint *)(local_650.ray + 0x1b4) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1b4);
                          *(uint *)(local_650.ray + 0x1b8) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1b8);
                          *(uint *)(local_650.ray + 0x1bc) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1bc);
                          iVar1 = *(int *)(local_650.hit + 0x44);
                          iVar2 = *(int *)(local_650.hit + 0x48);
                          iVar56 = *(int *)(local_650.hit + 0x4c);
                          iVar57 = *(int *)(local_650.hit + 0x50);
                          iVar58 = *(int *)(local_650.hit + 0x54);
                          iVar59 = *(int *)(local_650.hit + 0x58);
                          iVar60 = *(int *)(local_650.hit + 0x5c);
                          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar17 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_650.ray + 0x1c0) =
                               (uint)(bVar62 & 1) * *(int *)(local_650.hit + 0x40) |
                               (uint)!(bool)(bVar62 & 1) * *(int *)(local_650.ray + 0x1c0);
                          *(uint *)(local_650.ray + 0x1c4) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x1c4);
                          *(uint *)(local_650.ray + 0x1c8) =
                               (uint)bVar12 * iVar2 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x1c8);
                          *(uint *)(local_650.ray + 0x1cc) =
                               (uint)bVar13 * iVar56 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1cc);
                          *(uint *)(local_650.ray + 0x1d0) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1d0);
                          *(uint *)(local_650.ray + 0x1d4) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1d4);
                          *(uint *)(local_650.ray + 0x1d8) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1d8);
                          *(uint *)(local_650.ray + 0x1dc) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1dc);
                          iVar1 = *(int *)(local_650.hit + 100);
                          iVar2 = *(int *)(local_650.hit + 0x68);
                          iVar56 = *(int *)(local_650.hit + 0x6c);
                          iVar57 = *(int *)(local_650.hit + 0x70);
                          iVar58 = *(int *)(local_650.hit + 0x74);
                          iVar59 = *(int *)(local_650.hit + 0x78);
                          iVar60 = *(int *)(local_650.hit + 0x7c);
                          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar17 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_650.ray + 0x1e0) =
                               (uint)(bVar62 & 1) * *(int *)(local_650.hit + 0x60) |
                               (uint)!(bool)(bVar62 & 1) * *(int *)(local_650.ray + 0x1e0);
                          *(uint *)(local_650.ray + 0x1e4) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x1e4);
                          *(uint *)(local_650.ray + 0x1e8) =
                               (uint)bVar12 * iVar2 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x1e8);
                          *(uint *)(local_650.ray + 0x1ec) =
                               (uint)bVar13 * iVar56 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1ec);
                          *(uint *)(local_650.ray + 0x1f0) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1f0);
                          *(uint *)(local_650.ray + 500) =
                               (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_650.ray + 500)
                          ;
                          *(uint *)(local_650.ray + 0x1f8) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1f8);
                          *(uint *)(local_650.ray + 0x1fc) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1fc);
                          iVar1 = *(int *)(local_650.hit + 0x84);
                          iVar2 = *(int *)(local_650.hit + 0x88);
                          iVar56 = *(int *)(local_650.hit + 0x8c);
                          iVar57 = *(int *)(local_650.hit + 0x90);
                          iVar58 = *(int *)(local_650.hit + 0x94);
                          iVar59 = *(int *)(local_650.hit + 0x98);
                          iVar60 = *(int *)(local_650.hit + 0x9c);
                          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar17 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_650.ray + 0x200) =
                               (uint)(bVar62 & 1) * *(int *)(local_650.hit + 0x80) |
                               (uint)!(bool)(bVar62 & 1) * *(int *)(local_650.ray + 0x200);
                          *(uint *)(local_650.ray + 0x204) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x204);
                          *(uint *)(local_650.ray + 0x208) =
                               (uint)bVar12 * iVar2 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x208);
                          *(uint *)(local_650.ray + 0x20c) =
                               (uint)bVar13 * iVar56 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x20c);
                          *(uint *)(local_650.ray + 0x210) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x210);
                          *(uint *)(local_650.ray + 0x214) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x214);
                          *(uint *)(local_650.ray + 0x218) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x218);
                          *(uint *)(local_650.ray + 0x21c) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x21c);
                          auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar103;
                          auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar103;
                          auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar103;
                          auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_650.hit + 0x100));
                          *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar103;
                          auVar214 = ZEXT464(*(uint *)(ray + sVar69 * 4 + 0x100));
                        }
                        bVar71 = ~(byte)(1 << ((uint)uVar63 & 0x1f)) & bVar71;
                        uVar139 = auVar214._0_4_;
                        auVar149._4_4_ = uVar139;
                        auVar149._0_4_ = uVar139;
                        auVar149._8_4_ = uVar139;
                        auVar149._12_4_ = uVar139;
                        auVar149._16_4_ = uVar139;
                        auVar149._20_4_ = uVar139;
                        auVar149._24_4_ = uVar139;
                        auVar149._28_4_ = uVar139;
                        uVar156 = vcmpps_avx512vl(auVar226._0_32_,auVar149,2);
                        if ((bVar71 & (byte)uVar156) == 0) goto LAB_01a6bd12;
                        bVar71 = bVar71 & (byte)uVar156;
                        uVar72 = (ulong)bVar71;
                        auVar150._8_4_ = 0x7f800000;
                        auVar150._0_8_ = 0x7f8000007f800000;
                        auVar150._12_4_ = 0x7f800000;
                        auVar150._16_4_ = 0x7f800000;
                        auVar150._20_4_ = 0x7f800000;
                        auVar150._24_4_ = 0x7f800000;
                        auVar150._28_4_ = 0x7f800000;
                        auVar103 = vblendmps_avx512vl(auVar150,auVar226._0_32_);
                        auVar128._0_4_ =
                             (uint)(bVar71 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                        bVar11 = (bool)(bVar71 >> 1 & 1);
                        auVar128._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar71 >> 2 & 1);
                        auVar128._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar71 >> 3 & 1);
                        auVar128._12_4_ =
                             (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar71 >> 4 & 1);
                        auVar128._16_4_ =
                             (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar71 >> 5 & 1);
                        auVar128._20_4_ =
                             (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar71 >> 6 & 1);
                        auVar128._24_4_ =
                             (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * 0x7f800000;
                        auVar128._28_4_ =
                             (uint)(bVar71 >> 7) * auVar103._28_4_ |
                             (uint)!(bool)(bVar71 >> 7) * 0x7f800000;
                        auVar103 = vshufps_avx(auVar128,auVar128,0xb1);
                        auVar103 = vminps_avx(auVar128,auVar103);
                        auVar104 = vshufpd_avx(auVar103,auVar103,5);
                        auVar103 = vminps_avx(auVar103,auVar104);
                        auVar104 = vpermpd_avx2(auVar103,0x4e);
                        auVar103 = vminps_avx(auVar103,auVar104);
                        uVar156 = vcmpps_avx512vl(auVar128,auVar103,0);
                        bVar62 = (byte)uVar156 & bVar71;
                        if (bVar62 != 0) {
                          bVar71 = bVar62;
                        }
                        uVar64 = 0;
                        for (uVar65 = (uint)bVar71; (uVar65 & 1) == 0;
                            uVar65 = uVar65 >> 1 | 0x80000000) {
                          uVar64 = uVar64 + 1;
                        }
                        uVar63 = (ulong)uVar64;
                      } while( true );
                    }
                    fVar138 = local_320[uVar63];
                    uVar139 = *(undefined4 *)(local_300 + uVar63 * 4);
                    fVar161 = 1.0 - fVar138;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar83 = vxorps_avx512vl(ZEXT416((uint)fVar161),auVar25);
                    auVar87 = ZEXT416((uint)(fVar138 * fVar161 * 4.0));
                    auVar82 = vfnmsub213ss_fma(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),auVar87
                                              );
                    auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),auVar87)
                    ;
                    fVar161 = fVar161 * auVar83._0_4_ * 0.5;
                    fVar209 = auVar82._0_4_ * 0.5;
                    auVar203 = ZEXT464((uint)fVar209);
                    fVar210 = auVar87._0_4_ * 0.5;
                    fVar173 = fVar138 * fVar138 * 0.5;
                    auVar186._0_4_ = fVar173 * fVar153;
                    auVar186._4_4_ = fVar173 * fVar154;
                    auVar186._8_4_ = fVar173 * fVar155;
                    auVar186._12_4_ = fVar173 * fVar61;
                    auVar168._4_4_ = fVar210;
                    auVar168._0_4_ = fVar210;
                    auVar168._8_4_ = fVar210;
                    auVar168._12_4_ = fVar210;
                    auVar87 = vfmadd132ps_fma(auVar168,auVar186,auVar18);
                    auVar187._4_4_ = fVar209;
                    auVar187._0_4_ = fVar209;
                    auVar187._8_4_ = fVar209;
                    auVar187._12_4_ = fVar209;
                    auVar87 = vfmadd132ps_fma(auVar187,auVar87,auVar76);
                    auVar195 = ZEXT1664(auVar87);
                    auVar169._4_4_ = fVar161;
                    auVar169._0_4_ = fVar161;
                    auVar169._8_4_ = fVar161;
                    auVar169._12_4_ = fVar161;
                    auVar87 = vfmadd213ps_fma(auVar169,auVar75,auVar87);
                    *(undefined4 *)(ray + sVar69 * 4 + 0x100) =
                         *(undefined4 *)(local_2e0 + uVar63 * 4);
                    *(int *)(ray + sVar69 * 4 + 0x180) = auVar87._0_4_;
                    uVar8 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + sVar69 * 4 + 0x1a0) = uVar8;
                    uVar8 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + sVar69 * 4 + 0x1c0) = uVar8;
                    *(float *)(ray + sVar69 * 4 + 0x1e0) = fVar138;
                    *(undefined4 *)(ray + sVar69 * 4 + 0x200) = uVar139;
                    *(undefined4 *)(ray + sVar69 * 4 + 0x220) = uVar3;
                    *(uint *)(ray + sVar69 * 4 + 0x240) = uVar68;
                    *(uint *)(ray + sVar69 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + sVar69 * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a6b949;
      }
LAB_01a6afba:
      uVar3 = *(undefined4 *)(ray + sVar69 * 4 + 0x100);
      auVar24._4_4_ = uVar3;
      auVar24._0_4_ = uVar3;
      auVar24._8_4_ = uVar3;
      auVar24._12_4_ = uVar3;
      uVar156 = vcmpps_avx512vl(auVar228._0_16_,auVar24,2);
      uVar68 = (uint)uVar70 & (uint)uVar156;
      uVar70 = (ulong)uVar68;
    } while (uVar68 != 0);
  }
  return;
LAB_01a6bd12:
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar87);
  auVar228 = ZEXT1664(local_5d0);
  auVar229 = ZEXT3264(_DAT_01faff40);
LAB_01a6b949:
  lVar67 = lVar67 + 8;
  if (iVar7 <= (int)lVar67) goto LAB_01a6afba;
  goto LAB_01a6b05b;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }